

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_detection.cpp
# Opt level: O2

bool __thiscall
duckdb::CSVSniffer::CanYouCastIt
          (CSVSniffer *this,ClientContext *context,string_t value,LogicalType *type,
          DialectOptions *dialect_options,bool is_null,char decimal_separator,
          char thousands_separator)

{
  PhysicalType PVar1;
  char cVar2;
  undefined1 auVar3 [12];
  string_t val;
  string_t input;
  string_t input_00;
  bool bVar4;
  byte bVar5;
  DateCastResult DVar6;
  bool bVar7;
  short sVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  undefined4 extraout_var_13;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char *pcVar14;
  undefined7 extraout_var_01;
  const_iterator cVar15;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  undefined7 extraout_var_06;
  undefined7 extraout_var_07;
  undefined7 extraout_var_08;
  undefined7 extraout_var_09;
  undefined7 extraout_var_10;
  undefined7 extraout_var_11;
  undefined7 extraout_var_12;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  InvalidInputException *this_00;
  InternalException *pIVar20;
  int iVar21;
  LogicalType *this_01;
  BaseScanner *pBVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  BaseScanner *pBVar24;
  PhysicalType type_00;
  PhysicalType type_01;
  short sVar25;
  ulong uVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  char *pcVar28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  char cVar31;
  int iVar32;
  idx_t len;
  ushort uVar33;
  ulong uVar34;
  byte bVar35;
  LogicalType *pLVar36;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_R10;
  undefined7 uVar37;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_R11;
  BaseScanner *pBVar38;
  byte *pbVar39;
  _Alloc_hider this_02;
  char *pcVar40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar41;
  from_chars_result fVar42;
  uint8_t scale;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  undefined8 local_130;
  float dummy_value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  string_t value_local;
  bool special;
  undefined7 uStack_c7;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  ExponentData exponent;
  LogicalType local_68;
  string strip_thousands;
  
  this_01 = value.value._8_8_;
  value_local.value.pointer.ptr = (char *)value.value._0_8_;
  if ((int)dialect_options != 0) {
    return (bool)1;
  }
  this_02._M_p = value_local.value.pointer.ptr;
  if ((uint)context < 0xd) {
    this_02._M_p = value_local.value.pointer.prefix;
  }
  strip_thousands._M_dataplus._M_p = (pointer)&strip_thousands.field_2;
  strip_thousands._M_string_length = 0;
  strip_thousands.field_2._M_local_buf[0] = '\0';
  pLVar36 = type;
  value_local.value._0_8_ = context;
  bVar4 = LogicalType::IsNumeric(this_01);
  pcVar28 = (char *)((ulong)context & 0xffffffff);
  if (bVar4 && decimal_separator != '\0') {
    BaseScanner::RemoveSeparator_abi_cxx11_
              ((string *)&dummy_value,(BaseScanner *)this_02._M_p,
               (char *)((ulong)context & 0xffffffff),(ulong)(uint)(int)decimal_separator,
               (char)pLVar36);
    ::std::__cxx11::string::operator=((string *)&strip_thousands,(string *)&dummy_value);
    ::std::__cxx11::string::~string((string *)&dummy_value);
    pcVar28 = (char *)strip_thousands._M_string_length;
    this_02 = strip_thousands._M_dataplus;
  }
  uVar9 = this_01->id_ - 10;
  if (0x15 < uVar9) {
switchD_018b5490_caseD_11:
    LogicalType::LogicalType(&local_68,SQLNULL);
    Value::Value((Value *)&dummy_value,&local_68);
    LogicalType::~LogicalType(&local_68);
    _special = (pointer)&local_b8;
    local_c0 = 0;
    local_b8._M_local_buf[0] = '\0';
    val.value.pointer.ptr = value_local.value.pointer.ptr;
    val.value._0_8_ = value_local.value._0_8_;
    Value::Value((Value *)&exponent,val);
    bVar4 = Value::TryCastAs((Value *)&exponent,(ClientContext *)this,this_01,(Value *)&dummy_value,
                             (string *)&special,true);
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(extraout_var_03,bVar4 && local_c0 == 0);
    Value::~Value((Value *)&exponent);
    ::std::__cxx11::string::~string((string *)&special);
    Value::~Value((Value *)&dummy_value);
    paVar29 = local_140;
    goto LAB_018b9355;
  }
  lVar13 = (long)&switchD_018b5490::switchdataD_0201a230 +
           (long)(int)(&switchD_018b5490::switchdataD_0201a230)[uVar9];
  uVar37 = (undefined7)((ulong)lVar13 >> 8);
  switch((uint)this_01->id_) {
  case 10:
    switch(pcVar28) {
    case (char *)0x1:
      iVar21 = tolower((int)*(char *)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner);
      paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71((int7)(CONCAT44(extraout_var_13,iVar21) >> 8),
                            (char)iVar21 == 'f' || (char)iVar21 == 't');
      goto LAB_018b9355;
    case (char *)0x2:
      iVar21 = tolower((int)*(char *)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner);
      uVar9 = tolower((int)*(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1));
      local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      paVar29 = local_140;
      if (((char)iVar21 != 'n') || (lVar13 = 0, (uVar9 & 0xff) != 0x6f)) goto LAB_018b9355;
      break;
    case (char *)0x3:
      iVar21 = tolower((int)*(char *)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner);
      uVar9 = tolower((int)*(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1));
      uVar10 = tolower((int)*(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 2));
      if ((char)iVar21 != 'y') goto switchD_018b54ad_default;
      local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      paVar29 = local_140;
      if (((uVar9 & 0xff) != 0x65) || (lVar13 = 0, (uVar10 & 0xff) != 0x73)) goto LAB_018b9355;
      break;
    case (char *)0x4:
      iVar21 = tolower((int)*(char *)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner);
      uVar9 = tolower((int)*(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1));
      uVar10 = tolower((int)*(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 2));
      uVar12 = tolower((int)*(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 3));
      if (((char)iVar21 != 't') || ((uVar9 & 0xff) != 0x72)) goto switchD_018b54ad_default;
      local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      paVar29 = local_140;
      if ((uVar10 & 0xff) != 0x75) goto LAB_018b9355;
LAB_018b5d6f:
      local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      lVar13 = 0;
      paVar29 = local_140;
      if ((uVar12 & 0xff) != 0x65) goto LAB_018b9355;
      break;
    case (char *)0x5:
      iVar21 = tolower((int)*(char *)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner);
      uVar9 = tolower((int)*(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1));
      uVar10 = tolower((int)*(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 2));
      uVar11 = tolower((int)*(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 3));
      uVar12 = tolower((int)*(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 4));
      if ((((char)iVar21 == 'f') && ((uVar9 & 0xff) == 0x61)) && ((uVar10 & 0xff) == 0x6c)) {
        local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        paVar29 = local_140;
        if ((uVar11 & 0xff) != 0x73) goto LAB_018b9355;
        goto LAB_018b5d6f;
      }
    default:
      goto switchD_018b54ad_default;
    }
switchD_018b5490_caseD_19:
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71((int7)((ulong)lVar13 >> 8),1);
    goto LAB_018b9355;
  case 0xb:
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(uVar37,1);
    for (paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0; uVar34 = (long)pcVar28 - (long)paVar29, uVar34 != 0;
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar29 + 1)) {
      bVar35 = paVar29->_M_local_buf[(long)(&((BaseScanner *)this_02._M_p)->states + -0x20)];
      if ((4 < bVar35 - 9) && (bVar35 != 0x20)) {
        if (bVar35 == 0x2d) {
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar28 + -(long)paVar29);
          cVar31 = '\0';
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          goto LAB_018b564d;
        }
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pcVar28 + -1) != paVar29) && (bVar35 == 0x30)) {
          cVar31 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
                   [(long)paVar29];
          local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)~(ulong)paVar29;
          if (cVar31 == 'B') {
LAB_018b75d2:
            local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pcVar28 + (long)local_130);
            paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x1;
            bVar35 = 0;
            goto LAB_018b75dc;
          }
          if (cVar31 != 'x') {
            if (cVar31 == 'b') goto LAB_018b75d2;
            if (cVar31 != 'X') goto LAB_018b6671;
          }
          local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pcVar28 + (long)local_130);
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((ulong)local_138 & 0xffffffff00000000);
          goto LAB_018b613a;
        }
LAB_018b6671:
        uVar26 = (ulong)(bVar35 == 0x2b);
        cVar31 = '\0';
        uVar16 = uVar26;
        goto LAB_018b6681;
      }
    }
    goto LAB_018b87fa;
  case 0xc:
    for (pcVar14 = (char *)0x0; len = (long)pcVar28 - (long)pcVar14,
        pBVar22 = (BaseScanner *)this_02._M_p, len != 0; pcVar14 = pcVar14 + 1) {
      bVar35 = pcVar14[(long)(&((BaseScanner *)this_02._M_p)->states + -0x20)];
      if ((0x20 < (ulong)bVar35) || ((0x100003e00U >> ((ulong)bVar35 & 0x3f) & 1) == 0)) {
        exponent.result = 0;
        if (bVar35 == 0x2d) {
          bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar14 + (long)(&((BaseScanner *)this_02._M_p)->states + -0x20),len,
                             &exponent,true);
        }
        else {
          if ((pcVar28 + -1 != pcVar14) && (bVar35 == 0x30)) {
            cVar31 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
                     [(long)pcVar14];
            in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)~(ulong)pcVar14;
            if (cVar31 == 'B') {
LAB_018b7a30:
              in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pcVar28 + (long)in_R10);
              paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x1;
              goto LAB_018b7a38;
            }
            if (cVar31 != 'x') {
              if (cVar31 == 'b') goto LAB_018b7a30;
              if (cVar31 != 'X') {
                if (9 < (byte)(cVar31 - 0x30U)) goto LAB_018b8de9;
                break;
              }
            }
            local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pcVar28 + (long)in_R10);
            iVar21 = 0;
            paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x1;
            goto LAB_018b6767;
          }
LAB_018b8de9:
          bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar14 + (long)(&((BaseScanner *)this_02._M_p)->states + -0x20),len,
                             &exponent,true);
        }
        in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT71((int7)((ulong)in_R10 >> 8),1);
        paVar29 = in_R10;
        if (bVar4 != false) goto LAB_018b9355;
        break;
      }
    }
    goto LAB_018b8e19;
  case 0xd:
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(uVar37,1);
    pBVar38 = (BaseScanner *)this_02._M_p;
    pBVar22 = (BaseScanner *)this_02._M_p;
    for (pcVar14 = pcVar28; pBVar22 = (BaseScanner *)((long)&pBVar22->_vptr_BaseScanner + 1),
        pBVar24 = (BaseScanner *)this_02._M_p, pcVar14 != (char *)0x0; pcVar14 = pcVar14 + -1) {
      bVar35 = *(byte *)&pBVar38->_vptr_BaseScanner;
      if ((4 < bVar35 - 9) && (bVar35 != 0x20)) {
        paVar29 = local_140;
        if (bVar35 == 0x2d) {
          iVar21 = 0;
          pcVar40 = (char *)0x2;
          goto LAB_018b5982;
        }
        if ((pcVar14 == (char *)0x1) || (bVar35 != 0x30)) {
          if (bVar35 != 0x2b) {
LAB_018b84b8:
            iVar21 = 0;
            pcVar40 = (char *)0x0;
            goto LAB_018b84bd;
          }
          break;
        }
        cVar31 = *(char *)((long)&pBVar38->_vptr_BaseScanner + 1);
        if (cVar31 == 'B') {
LAB_018b77d6:
          paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar14 + -1);
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          iVar21 = 0;
          goto LAB_018b77e1;
        }
        if (cVar31 != 'x') {
          if (cVar31 == 'b') goto LAB_018b77d6;
          if (cVar31 != 'X') {
            if (9 < (byte)(cVar31 - 0x30U)) goto LAB_018b84b8;
            break;
          }
        }
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar14 + -1);
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
        local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((ulong)local_130._4_4_ << 0x20);
        goto LAB_018b65b0;
      }
      pBVar38 = (BaseScanner *)((long)&pBVar38->_vptr_BaseScanner + 1);
    }
    goto LAB_018b6e3a;
  case 0xe:
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(uVar37,1);
    pBVar38 = (BaseScanner *)this_02._M_p;
    pBVar22 = (BaseScanner *)this_02._M_p;
    for (pcVar14 = pcVar28; pBVar22 = (BaseScanner *)((long)&pBVar22->_vptr_BaseScanner + 1),
        pBVar24 = (BaseScanner *)this_02._M_p, pcVar14 != (char *)0x0; pcVar14 = pcVar14 + -1) {
      bVar35 = *(byte *)&pBVar38->_vptr_BaseScanner;
      if ((4 < bVar35 - 9) && (bVar35 != 0x20)) {
        paVar29 = local_140;
        if (bVar35 == 0x2d) {
          pcVar40 = (char *)0x2;
          lVar13 = 0;
          goto LAB_018b572b;
        }
        if ((pcVar14 == (char *)0x1) || (bVar35 != 0x30)) {
          if (bVar35 != 0x2b) {
LAB_018b82ef:
            lVar13 = 0;
            pcVar40 = (char *)0x0;
            goto LAB_018b82f7;
          }
          break;
        }
        cVar31 = *(char *)((long)&pBVar38->_vptr_BaseScanner + 1);
        if (cVar31 == 'B') {
LAB_018b7663:
          paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar14 + -1);
          pcVar14 = (char *)0x0;
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          goto LAB_018b766e;
        }
        if (cVar31 != 'x') {
          if (cVar31 == 'b') goto LAB_018b7663;
          if (cVar31 != 'X') {
            if (9 < (byte)(cVar31 - 0x30U)) goto LAB_018b82ef;
            break;
          }
        }
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar14 + -1);
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
        local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        goto LAB_018b624c;
      }
      pBVar38 = (BaseScanner *)((long)&pBVar38->_vptr_BaseScanner + 1);
    }
    goto LAB_018b6976;
  case 0xf:
    dummy_value._0_1_ = 0xf;
    cVar15 = ::std::
             _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::find((_Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                     *)(type + 3),(key_type *)&dummy_value);
    bVar4 = StrTimeFormat::Empty((StrTimeFormat *)&cVar15._M_node[1]._M_left);
    if (!bVar4) {
      _dummy_value = (pointer)local_118;
      paStack_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
      local_118[0]._M_allocated_capacity = local_118[0]._M_allocated_capacity & 0xffffffffffffff00;
      special = true;
      cVar15 = ::std::
               _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
               ::find((_Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                       *)(type + 3),&special);
      input.value.pointer.ptr = value_local.value.pointer.ptr;
      input.value._0_8_ = value_local.value._0_8_;
      bVar4 = StrpTimeFormat::TryParseDate
                        ((StrpTimeFormat *)&cVar15._M_node[1]._M_left,input,(date_t *)&exponent,
                         (string *)&dummy_value);
      local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(extraout_var_05,bVar4);
LAB_018b5c35:
      ::std::__cxx11::string::~string((string *)&dummy_value);
      paVar29 = local_140;
      goto LAB_018b9355;
    }
    DVar6 = Date::TryConvertDate
                      (this_02._M_p,(idx_t)pcVar28,(idx_t *)&dummy_value,(date_t *)&exponent,
                       &special,true);
    uVar37 = extraout_var;
    goto LAB_018b5a84;
  case 0x10:
    bVar4 = Time::TryConvertTime
                      (this_02._M_p,(idx_t)pcVar28,(idx_t *)&dummy_value,(dtime_t *)&exponent,true,
                       (optional_ptr<int,_true>)0x0);
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(extraout_var_00,bVar4);
    goto LAB_018b9355;
  default:
    goto switchD_018b5490_caseD_11;
  case 0x13:
    dummy_value._0_1_ = 0x13;
    cVar15 = ::std::
             _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::find((_Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                     *)(type + 3),(key_type *)&dummy_value);
    bVar4 = StrTimeFormat::Empty((StrTimeFormat *)&cVar15._M_node[1]._M_left);
    if (!bVar4) {
      _dummy_value = (pointer)local_118;
      paStack_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
      local_118[0]._M_allocated_capacity = local_118[0]._M_allocated_capacity & 0xffffffffffffff00;
      special = true;
      cVar15 = ::std::
               _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
               ::find((_Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                       *)(type + 3),&special);
      input_00.value.pointer.ptr = value_local.value.pointer.ptr;
      input_00.value._0_8_ = value_local.value._0_8_;
      bVar4 = StrpTimeFormat::TryParseTimestamp
                        ((StrpTimeFormat *)&cVar15._M_node[1]._M_left,input_00,
                         (timestamp_t *)&exponent,(string *)&dummy_value);
      local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(extraout_var_06,bVar4);
      goto LAB_018b5c35;
    }
    DVar6 = Timestamp::TryConvertTimestamp
                      (this_02._M_p,(idx_t)pcVar28,(timestamp_t *)&exponent,
                       (optional_ptr<int,_true>)0x0,true);
    uVar37 = extraout_var_02;
LAB_018b5a84:
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(uVar37,DVar6 == SUCCESS);
    goto LAB_018b9355;
  case 0x15:
    LogicalType::GetDecimalProperties(this_01,&special,&scale);
    if (is_null == true) {
      PVar1 = this_01->physical_type_;
      if (PVar1 == INT128) {
        bVar4 = TryDecimalStringCast<duckdb::hugeint_t,(char)46>
                          (this_02._M_p,(idx_t)pcVar28,(hugeint_t *)&dummy_value,special,scale);
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(extraout_var_09,bVar4);
      }
      else if (PVar1 == INT32) {
        bVar4 = TryDecimalStringCast<int,(char)46>
                          (this_02._M_p,(idx_t)pcVar28,(int *)&dummy_value,special,scale);
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(extraout_var_11,bVar4);
      }
      else if (PVar1 == INT64) {
        bVar4 = TryDecimalStringCast<long,(char)46>
                          (this_02._M_p,(idx_t)pcVar28,(long *)&dummy_value,special,scale);
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(extraout_var_07,bVar4);
      }
      else {
        if (PVar1 != INT16) {
          pIVar20 = (InternalException *)__cxa_allocate_exception(0x10);
          TypeIdToString_abi_cxx11_
                    ((string *)&exponent,(duckdb *)(ulong)this_01->physical_type_,type_01);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &dummy_value,"Invalid Physical Type for Decimal Value. Physical Type: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &exponent);
          InternalException::InternalException(pIVar20,(string *)&dummy_value);
          __cxa_throw(pIVar20,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar4 = TryDecimalStringCast<short,(char)46>
                          (this_02._M_p,(idx_t)pcVar28,(short *)&dummy_value,special,scale);
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(extraout_var_04,bVar4);
      }
    }
    else {
      if (is_null != true) {
        this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&dummy_value,
                   "Decimals can only have \',\' and \'.\' as decimal separators",
                   (allocator *)&exponent);
        InvalidInputException::InvalidInputException(this_00,(string *)&dummy_value);
        __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      PVar1 = this_01->physical_type_;
      if (PVar1 == INT16) {
        bVar4 = TryDecimalStringCast<short,(char)44>
                          (this_02._M_p,(idx_t)pcVar28,(short *)&dummy_value,special,scale);
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(extraout_var_10,bVar4);
      }
      else if (PVar1 == INT32) {
        bVar4 = TryDecimalStringCast<int,(char)44>
                          (this_02._M_p,(idx_t)pcVar28,(int *)&dummy_value,special,scale);
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(extraout_var_12,bVar4);
      }
      else if (PVar1 == INT64) {
        bVar4 = TryDecimalStringCast<long,(char)44>
                          (this_02._M_p,(idx_t)pcVar28,(long *)&dummy_value,special,scale);
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(extraout_var_08,bVar4);
      }
      else {
        if (PVar1 != INT128) {
          pIVar20 = (InternalException *)__cxa_allocate_exception(0x10);
          TypeIdToString_abi_cxx11_
                    ((string *)&exponent,(duckdb *)(ulong)this_01->physical_type_,type_00);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &dummy_value,"Invalid Physical Type for Decimal Value. Physical Type: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &exponent);
          InternalException::InternalException(pIVar20,(string *)&dummy_value);
          __cxa_throw(pIVar20,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar4 = TryDecimalStringCast<duckdb::hugeint_t,(char)44>
                          (this_02._M_p,(idx_t)pcVar28,(hugeint_t *)&dummy_value,special,scale);
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(extraout_var_01,bVar4);
      }
    }
    goto LAB_018b9355;
  case 0x16:
    while (pcVar28 != (char *)0x0) {
      bVar35 = *(byte *)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner;
      if ((4 < bVar35 - 9) && (bVar35 != 0x20)) {
        if ((bVar35 != 0x2b) &&
           (((pcVar28 == (char *)0x1 || (bVar35 != 0x30)) ||
            (9 < (byte)(*(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1) -
                       0x30U))))) {
          pcVar28 = pcVar28 + (long)this_02._M_p;
          fVar42 = duckdb_fast_float::from_chars<float>
                             (this_02._M_p,pcVar28,&dummy_value,true,is_null,general);
          auVar3 = fVar42._0_12_;
LAB_018b634f:
          paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(auVar3._1_7_,auVar3._0_8_ == pcVar28 && auVar3._8_4_ == 0);
          goto LAB_018b9355;
        }
        break;
      }
      this_02._M_p = (pointer)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
      pcVar28 = pcVar28 + -1;
    }
    break;
  case 0x17:
    while (pcVar28 != (char *)0x0) {
      bVar35 = *(byte *)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner;
      if ((4 < bVar35 - 9) && (bVar35 != 0x20)) {
        if ((bVar35 != 0x2b) &&
           (((pcVar28 == (char *)0x1 || (bVar35 != 0x30)) ||
            (9 < (byte)(*(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1) -
                       0x30U))))) {
          pcVar28 = pcVar28 + (long)this_02._M_p;
          fVar42 = duckdb_fast_float::from_chars<double>
                             (this_02._M_p,pcVar28,(double *)&dummy_value,true,is_null,general);
          auVar3 = fVar42._0_12_;
          goto LAB_018b634f;
        }
        break;
      }
      this_02._M_p = (pointer)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
      pcVar28 = pcVar28 + -1;
    }
    break;
  case 0x19:
    goto switchD_018b5490_caseD_19;
  case 0x1c:
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(uVar37,1);
    pBVar38 = (BaseScanner *)this_02._M_p;
    pBVar22 = (BaseScanner *)this_02._M_p;
    for (pcVar14 = pcVar28; pBVar22 = (BaseScanner *)((long)&pBVar22->_vptr_BaseScanner + 1),
        pBVar24 = (BaseScanner *)this_02._M_p, pcVar14 != (char *)0x0; pcVar14 = pcVar14 + -1) {
      bVar35 = *(byte *)&pBVar38->_vptr_BaseScanner;
      if ((4 < bVar35 - 9) && (bVar35 != 0x20)) {
        paVar29 = local_140;
        if (bVar35 == 0x2d) {
          pcVar40 = (char *)0x2;
          goto LAB_018b55e3;
        }
        if ((pcVar14 == (char *)0x1) || (bVar35 != 0x30)) {
          if (bVar35 != 0x2b) {
LAB_018b6915:
            bVar35 = 0;
            pcVar40 = (char *)0x0;
            goto LAB_018b691c;
          }
          break;
        }
        cVar31 = *(char *)((long)&pBVar38->_vptr_BaseScanner + 1);
        if (cVar31 == 'B') {
LAB_018b755a:
          paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar14 + -1);
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          bVar35 = 0;
          goto LAB_018b7562;
        }
        if (cVar31 != 'x') {
          if (cVar31 == 'b') goto LAB_018b755a;
          if (cVar31 != 'X') {
            if (9 < (byte)(cVar31 - 0x30U)) goto LAB_018b6915;
            break;
          }
        }
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar14 + -1);
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
        local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((ulong)local_130._4_4_ << 0x20);
        goto LAB_018b6028;
      }
      pBVar38 = (BaseScanner *)((long)&pBVar38->_vptr_BaseScanner + 1);
    }
    goto LAB_018b800f;
  case 0x1d:
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(uVar37,1);
    pBVar38 = (BaseScanner *)this_02._M_p;
    pBVar22 = (BaseScanner *)this_02._M_p;
    for (pcVar14 = pcVar28; pBVar22 = (BaseScanner *)((long)&pBVar22->_vptr_BaseScanner + 1),
        pBVar24 = (BaseScanner *)this_02._M_p, pcVar14 != (char *)0x0; pcVar14 = pcVar14 + -1) {
      bVar35 = *(byte *)&pBVar38->_vptr_BaseScanner;
      if ((4 < bVar35 - 9) && (bVar35 != 0x20)) {
        paVar29 = local_140;
        if (bVar35 == 0x2d) {
          pcVar40 = (char *)0x2;
          goto LAB_018b550e;
        }
        if ((pcVar14 == (char *)0x1) || (bVar35 != 0x30)) {
          if (bVar35 != 0x2b) {
LAB_018b68c4:
            uVar33 = 0;
            pcVar40 = (char *)0x0;
            goto LAB_018b68cd;
          }
          break;
        }
        cVar31 = *(char *)((long)&pBVar38->_vptr_BaseScanner + 1);
        if (cVar31 == 'B') {
LAB_018b74df:
          paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar14 + -1);
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          sVar8 = 0;
          goto LAB_018b74e7;
        }
        if (cVar31 != 'x') {
          if (cVar31 == 'b') goto LAB_018b74df;
          if (cVar31 != 'X') {
            if (9 < (byte)(cVar31 - 0x30U)) goto LAB_018b68c4;
            break;
          }
        }
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar14 + -1);
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
        local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((ulong)local_130._4_4_ << 0x20);
        goto LAB_018b5f1a;
      }
      pBVar38 = (BaseScanner *)((long)&pBVar38->_vptr_BaseScanner + 1);
    }
    goto LAB_018b7d21;
  case 0x1e:
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(uVar37,1);
    pBVar38 = (BaseScanner *)this_02._M_p;
    pBVar22 = (BaseScanner *)this_02._M_p;
    for (pcVar14 = pcVar28; pBVar22 = (BaseScanner *)((long)&pBVar22->_vptr_BaseScanner + 1),
        pBVar24 = (BaseScanner *)this_02._M_p, pcVar14 != (char *)0x0; pcVar14 = pcVar14 + -1) {
      bVar35 = *(byte *)&pBVar38->_vptr_BaseScanner;
      if ((4 < bVar35 - 9) && (bVar35 != 0x20)) {
        paVar29 = local_140;
        if (bVar35 == 0x2d) {
          pcVar40 = (char *)0x2;
          goto LAB_018b587a;
        }
        if ((pcVar14 == (char *)0x1) || (bVar35 != 0x30)) {
          if (bVar35 != 0x2b) {
LAB_018b8391:
            uVar9 = 0;
            pcVar40 = (char *)0x0;
            goto LAB_018b8396;
          }
          break;
        }
        cVar31 = *(char *)((long)&pBVar38->_vptr_BaseScanner + 1);
        if (cVar31 == 'B') {
LAB_018b76e8:
          paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar14 + -1);
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          iVar21 = 0;
          goto LAB_018b76f0;
        }
        if (cVar31 != 'x') {
          if (cVar31 == 'b') goto LAB_018b76e8;
          if (cVar31 != 'X') {
            if (9 < (byte)(cVar31 - 0x30U)) goto LAB_018b8391;
            break;
          }
        }
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar14 + -1);
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
        local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((ulong)local_130._4_4_ << 0x20);
        goto LAB_018b63a8;
      }
      pBVar38 = (BaseScanner *)((long)&pBVar38->_vptr_BaseScanner + 1);
    }
    goto LAB_018b6b21;
  case 0x1f:
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(uVar37,1);
    pcVar14 = (char *)0x2;
    pBVar38 = (BaseScanner *)this_02._M_p;
    pBVar22 = (BaseScanner *)this_02._M_p;
    for (pcVar40 = pcVar28; pBVar22 = (BaseScanner *)((long)&pBVar22->_vptr_BaseScanner + 1),
        pBVar24 = (BaseScanner *)this_02._M_p, pcVar40 != (char *)0x0; pcVar40 = pcVar40 + -1) {
      bVar35 = *(byte *)&pBVar38->_vptr_BaseScanner;
      if ((4 < bVar35 - 9) && (bVar35 != 0x20)) {
        paVar29 = local_140;
        if (bVar35 == 0x2d) goto LAB_018b58e7;
        if ((pcVar40 == (char *)0x1) || (bVar35 != 0x30)) {
          if (bVar35 != 0x2b) {
LAB_018b8422:
            uVar34 = 0;
            pcVar14 = (char *)0x0;
            goto LAB_018b842a;
          }
          break;
        }
        cVar31 = *(char *)((long)&pBVar38->_vptr_BaseScanner + 1);
        if (cVar31 == 'B') {
LAB_018b775b:
          paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar40 + -1);
          pcVar14 = (char *)0x0;
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          goto LAB_018b7766;
        }
        if (cVar31 != 'x') {
          if (cVar31 == 'b') goto LAB_018b775b;
          if (cVar31 != 'X') {
            if (9 < (byte)(cVar31 - 0x30U)) goto LAB_018b8422;
            break;
          }
        }
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar40 + -1);
        local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
        goto LAB_018b64aa;
      }
      pBVar38 = (BaseScanner *)((long)&pBVar38->_vptr_BaseScanner + 1);
    }
    goto LAB_018b6ccc;
  }
switchD_018b54ad_default:
  local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  paVar29 = local_140;
  goto LAB_018b9355;
LAB_018b58e7:
  if (pcVar40 <= pcVar14 + -1) goto LAB_018b688f;
  bVar35 = ((undefined1 *)((long)&pBVar38[-1].bytes_read + 7))[(long)pcVar14];
  if (9 < (byte)(bVar35 - 0x30)) {
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b6ccc;
    pbVar39 = (byte *)(pcVar14 + (long)(&pBVar38->states + -0x20));
    goto LAB_018b70d4;
  }
  pcVar14 = pcVar14 + 1;
  goto LAB_018b58e7;
LAB_018b688f:
  if (pcVar40 == (char *)0x1) goto LAB_018b6ccc;
  goto LAB_018b9355;
LAB_018b70d4:
  if (pcVar40 <= pcVar14) goto LAB_018b9355;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b6ccc;
  pbVar39 = pbVar39 + 1;
  pcVar14 = pcVar14 + 1;
  goto LAB_018b70d4;
LAB_018b7766:
  if (paVar29 <= paVar41) goto joined_r0x018b7ae9;
  cVar31 = ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar41];
  if (cVar31 == '0') {
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  }
  else {
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x1;
    if (cVar31 != '1') goto LAB_018b6ccc;
  }
  paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(paVar41->_M_local_buf + 1);
  paVar27 = paVar29;
  if ((((paVar29 != paVar30) &&
       (paVar27 = paVar30,
       ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar30] == '_')) &&
      ((paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar41->_M_local_buf + 2), paVar29 == paVar27 ||
       ((((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar27] & 0xfe) != 0x30))))
     || (paVar41 = paVar27, (long)pcVar14 < 0)) goto LAB_018b6ccc;
  pcVar14 = paVar23->_M_local_buf + (long)pcVar14 * 2;
  goto LAB_018b7766;
LAB_018b842a:
  if (pcVar40 == pcVar14) goto LAB_018b9355;
  bVar35 = pcVar14[(long)(&pBVar38->states + -0x20)];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b6ccc;
    pbVar39 = (byte *)(pcVar14 + (long)(&pBVar22->states + -0x20));
    goto LAB_018b8486;
  }
  if (~(ulong)bVar5 / 10 < uVar34) goto LAB_018b6ccc;
  pcVar14 = pcVar14 + 1;
  uVar34 = uVar34 * 10 + (ulong)bVar5;
  goto LAB_018b842a;
LAB_018b8486:
  pcVar14 = pcVar14 + 1;
  if (pcVar40 <= pcVar14) goto LAB_018b9355;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b6ccc;
  pbVar39 = pbVar39 + 1;
  goto LAB_018b8486;
LAB_018b64aa:
  if (paVar29 <= paVar41) goto joined_r0x018b7ae9;
  bVar35 = ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar41];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  if (!bVar4) goto LAB_018b6ccc;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  pcVar14 = (char *)((long)paVar41 + 1);
  paVar23 = paVar29;
  if ((((paVar29 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar14) &&
       (paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar14,
       ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)pcVar14] == '_')) &&
      ((pcVar14 = (char *)((long)paVar41 + 2),
       paVar29 ==
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar14 ||
       (local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar14,
       bVar4 = StringUtil::CharacterIsHex
                         (((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)pcVar14]),
       paVar23 = local_138, !bVar4)))) ||
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(~(ulong)(byte)(cVar31 + bVar5) >> 4) < local_130)) goto LAB_018b6ccc;
  local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)local_130 * 0x10 + (ulong)(byte)(cVar31 + bVar5));
  paVar41 = paVar23;
  goto LAB_018b64aa;
joined_r0x018b7ae9:
  paVar29 = local_140;
  if (paVar41 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x2) {
LAB_018b6ccc:
    do {
      pBVar24 = (BaseScanner *)((long)&pBVar24->_vptr_BaseScanner + 1);
      if (pcVar28 == (char *)0x0) goto LAB_018b934d;
      bVar35 = *(byte *)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner;
      if ((0x20 < (ulong)bVar35) || ((0x100003e00U >> ((ulong)bVar35 & 0x3f) & 1) == 0)) {
        _dummy_value = (pointer)0x0;
        paStack_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_118[0]._M_allocated_capacity = 0;
        if (bVar35 == 0x2d) {
          pcVar14 = (char *)0x2;
          _dummy_value = (pointer)0x0;
          goto LAB_018b6d07;
        }
        if ((pcVar28 == (char *)0x1) || (bVar35 != 0x30)) {
          if (bVar35 != 0x2b) {
LAB_018b7305:
            paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
            pcVar14 = (char *)0x0;
            goto LAB_018b7309;
          }
          goto LAB_018b934d;
        }
        cVar31 = *(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
        if (cVar31 == 'B') {
LAB_018b7c8f:
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar28 + -1);
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          goto LAB_018b7c9a;
        }
        if (cVar31 != 'x') {
          if (cVar31 == 'b') goto LAB_018b7c8f;
          if (cVar31 != 'X') {
            if (9 < (byte)(cVar31 - 0x30U)) goto LAB_018b7305;
            goto LAB_018b934d;
          }
        }
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar28 + -1);
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
        goto LAB_018b6d7c;
      }
      this_02._M_p = (pointer)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
      pcVar28 = pcVar28 + -1;
    } while( true );
  }
  goto LAB_018b9355;
LAB_018b6d07:
  if (pcVar28 <= pcVar14 + -1) goto LAB_018b71ce;
  bVar35 = ((undefined1 *)((long)&((BaseScanner *)((long)this_02._M_p + -0xd0))->bytes_read + 7))
           [(long)pcVar14];
  if (9 < (byte)(bVar35 - 0x30)) {
    in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    paVar29 = in_R10;
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b9355;
    pbVar39 = (byte *)(pcVar14 + (long)(&((BaseScanner *)this_02._M_p)->states + -0x20));
    goto LAB_018b7374;
  }
  _dummy_value = (pointer)((long)_dummy_value * 10 - (ulong)(byte)(bVar35 - 0x30));
  pcVar14 = pcVar14 + 1;
  goto LAB_018b6d07;
LAB_018b71ce:
  bVar4 = pcVar28 != (char *)0x1;
  goto LAB_018b78f0;
LAB_018b7374:
  if (pcVar28 <= pcVar14) goto LAB_018b78ee;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b934d;
  pbVar39 = pbVar39 + 1;
  pcVar14 = pcVar14 + 1;
  goto LAB_018b7374;
LAB_018b78ee:
  bVar4 = true;
LAB_018b78f0:
  bVar7 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,true>
                    ((IntegerDecimalCastData<unsigned_long> *)&dummy_value);
  goto LAB_018b9048;
LAB_018b7c9a:
  if (paVar30 <= paVar23) goto LAB_018b91ea;
  cVar31 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
           [(long)paVar23];
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  if ((cVar31 != '0') &&
     (in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1,
     paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0, cVar31 != '1')) goto LAB_018b9355;
  pcVar28 = (char *)((long)paVar23 + 1);
  paVar29 = paVar30;
  if ((((paVar30 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar28) &&
       (paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar28,
       ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))[(long)pcVar28]
       == '_')) &&
      ((paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar23 + 2), paVar30 == paVar29 ||
       ((((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
         [(long)paVar29] & 0xfe) != 0x30)))) || ((long)paVar41 < 0)) goto LAB_018b934d;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)in_R10 + (long)paVar41 * 2);
  paVar23 = paVar29;
  goto LAB_018b7c9a;
LAB_018b91ea:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                    ((IntegerDecimalCastData<unsigned_long> *)&dummy_value);
  goto LAB_018b9341;
LAB_018b7309:
  if (pcVar28 == pcVar14) goto LAB_018b85f6;
  bVar35 = pcVar14[(long)(&((BaseScanner *)this_02._M_p)->states + -0x20)];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    _dummy_value = (pointer)paVar41;
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b9355;
    pbVar39 = (byte *)(pcVar14 + (long)(&pBVar24->states + -0x20));
    goto LAB_018b87c9;
  }
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(~(ulong)bVar5 / 10) < paVar41) goto LAB_018b9355;
  pcVar14 = pcVar14 + 1;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 10 + (ulong)bVar5);
  goto LAB_018b7309;
LAB_018b87c9:
  pcVar14 = pcVar14 + 1;
  if (pcVar28 <= pcVar14) goto LAB_018b85f6;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b934d;
  pbVar39 = pbVar39 + 1;
  goto LAB_018b87c9;
LAB_018b85f6:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                    ((IntegerDecimalCastData<unsigned_long> *)&dummy_value);
  goto joined_r0x018b904a;
LAB_018b6d7c:
  if (paVar29 <= paVar23) goto LAB_018b9330;
  bVar35 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
           [(long)paVar23];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  if (!bVar4) goto LAB_018b934d;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  pcVar28 = (char *)((long)paVar23 + 1);
  paVar30 = paVar29;
  if ((((paVar29 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar28) &&
       (paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar28,
       ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))[(long)pcVar28]
       == '_')) &&
      ((paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar23 + 2), paVar29 == paVar30 ||
       (bVar4 = StringUtil::CharacterIsHex
                          (((undefined1 *)
                           ((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
                           [(long)paVar30]), !bVar4)))) ||
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(~(ulong)(byte)(cVar31 + bVar5) >> 4) < paVar41)) goto LAB_018b934d;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 0x10 + (ulong)(byte)(cVar31 + bVar5));
  paVar23 = paVar30;
  goto LAB_018b6d7c;
LAB_018b9330:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                    ((IntegerDecimalCastData<unsigned_long> *)&dummy_value);
  goto LAB_018b9341;
LAB_018b587a:
  if (pcVar14 <= pcVar40 + -1) goto LAB_018b6880;
  bVar35 = ((undefined1 *)((long)&pBVar38[-1].bytes_read + 7))[(long)pcVar40];
  if (9 < (byte)(bVar35 - 0x30)) {
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b6b21;
    pbVar39 = (byte *)(pcVar40 + (long)(&pBVar38->states + -0x20));
    goto LAB_018b7088;
  }
  pcVar40 = pcVar40 + 1;
  goto LAB_018b587a;
LAB_018b6880:
  if (pcVar14 == (char *)0x1) goto LAB_018b6b21;
  goto LAB_018b9355;
LAB_018b7088:
  if (pcVar14 <= pcVar40) goto LAB_018b9355;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b6b21;
  pbVar39 = pbVar39 + 1;
  pcVar40 = pcVar40 + 1;
  goto LAB_018b7088;
LAB_018b76f0:
  if (paVar29 <= paVar41) goto joined_r0x018b7ada;
  cVar31 = ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar41];
  iVar32 = 0;
  if (cVar31 != '0') {
    if (cVar31 != '1') goto LAB_018b6b21;
    iVar32 = 1;
  }
  paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(paVar41->_M_local_buf + 1);
  paVar30 = paVar29;
  if ((((paVar29 != paVar23) &&
       (paVar30 = paVar23,
       ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar23] == '_')) &&
      ((paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar41->_M_local_buf + 2), paVar29 == paVar30 ||
       ((((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar30] & 0xfe) != 0x30))))
     || (paVar41 = paVar30, iVar21 < 0)) goto LAB_018b6b21;
  iVar21 = iVar32 + iVar21 * 2;
  goto LAB_018b76f0;
LAB_018b8396:
  if (pcVar14 == pcVar40) goto LAB_018b9355;
  bVar35 = pcVar40[(long)(&pBVar38->states + -0x20)];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b6b21;
    pbVar39 = (byte *)(pcVar40 + (long)(&pBVar22->states + -0x20));
    goto LAB_018b83f0;
  }
  if (~(uint)bVar5 / 10 < uVar9) goto LAB_018b6b21;
  pcVar40 = pcVar40 + 1;
  uVar9 = uVar9 * 10 + (uint)bVar5;
  goto LAB_018b8396;
LAB_018b83f0:
  pcVar40 = pcVar40 + 1;
  if (pcVar14 <= pcVar40) goto LAB_018b9355;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b6b21;
  pbVar39 = pbVar39 + 1;
  goto LAB_018b83f0;
LAB_018b63a8:
  if (paVar29 <= paVar41) goto joined_r0x018b7ada;
  bVar35 = ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar41];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  local_138 = paVar41;
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  if (!bVar4) goto LAB_018b6b21;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  pcVar14 = (char *)((long)local_138 + 1);
  paVar41 = paVar29;
  if (((paVar29 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar14) &&
      (paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pcVar14,
      ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)pcVar14] == '_')) &&
     ((pcVar14 = (char *)((long)local_138 + 2),
      paVar29 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar14 ||
      (local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pcVar14,
      bVar4 = StringUtil::CharacterIsHex
                        (((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)pcVar14]),
      paVar41 = local_138, !bVar4)))) goto LAB_018b6b21;
  if (~(uint)(byte)(cVar31 + bVar5) >> 4 < (uint)local_130) goto LAB_018b6b21;
  local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_130._4_4_,(uint)local_130 * 0x10 + (uint)(byte)(cVar31 + bVar5));
  goto LAB_018b63a8;
joined_r0x018b7ada:
  paVar29 = local_140;
  if (paVar41 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x2) {
LAB_018b6b21:
    do {
      pBVar24 = (BaseScanner *)((long)&pBVar24->_vptr_BaseScanner + 1);
      if (pcVar28 == (char *)0x0) goto LAB_018b934d;
      bVar35 = *(byte *)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner;
      if ((0x20 < (ulong)bVar35) || ((0x100003e00U >> ((ulong)bVar35 & 0x3f) & 1) == 0)) {
        _dummy_value = (pointer)0x0;
        paStack_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_118[0]._M_allocated_capacity = 0;
        if (bVar35 == 0x2d) {
          pcVar14 = (char *)0x2;
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          goto LAB_018b6b6a;
        }
        if ((pcVar28 == (char *)0x1) || (bVar35 != 0x30)) {
          if (bVar35 != 0x2b) {
LAB_018b72b4:
            paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
            pcVar14 = (char *)0x0;
            goto LAB_018b72b8;
          }
          goto LAB_018b934d;
        }
        cVar31 = *(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
        if (cVar31 == 'B') {
LAB_018b7c0b:
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar28 + -1);
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          goto LAB_018b7c16;
        }
        if (cVar31 != 'x') {
          if (cVar31 == 'b') goto LAB_018b7c0b;
          if (cVar31 != 'X') {
            if (9 < (byte)(cVar31 - 0x30U)) goto LAB_018b72b4;
            goto LAB_018b934d;
          }
        }
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar28 + -1);
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
        goto LAB_018b6c05;
      }
      this_02._M_p = (pointer)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
      pcVar28 = pcVar28 + -1;
    } while( true );
  }
  goto LAB_018b9355;
LAB_018b6b6a:
  if (pcVar28 <= pcVar14 + -1) goto LAB_018b7201;
  bVar35 = ((undefined1 *)((long)&((BaseScanner *)((long)this_02._M_p + -0xd0))->bytes_read + 7))
           [(long)pcVar14];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    _dummy_value = (pointer)paVar41;
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b9355;
    pbVar39 = (byte *)(pcVar14 + (long)(&((BaseScanner *)this_02._M_p)->states + -0x20));
    goto LAB_018b746d;
  }
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  uVar34 = (0x8000000000000000 - (ulong)bVar5) / 10;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  if (SBORROW8((long)paVar41,-uVar34) != (long)(paVar41->_M_local_buf + uVar34) < 0)
  goto LAB_018b9355;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 10 - (ulong)bVar5);
  pcVar14 = pcVar14 + 1;
  goto LAB_018b6b6a;
LAB_018b7201:
  bVar4 = pcVar28 != (char *)0x1;
  goto LAB_018b7923;
LAB_018b746d:
  if (pcVar28 <= pcVar14) goto LAB_018b7921;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b934d;
  pbVar39 = pbVar39 + 1;
  pcVar14 = pcVar14 + 1;
  goto LAB_018b746d;
LAB_018b7921:
  bVar4 = true;
LAB_018b7923:
  _dummy_value = (pointer)paVar41;
  bVar7 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,true>
                    ((IntegerDecimalCastData<unsigned_int> *)&dummy_value);
  goto LAB_018b9048;
LAB_018b7c16:
  if (paVar30 <= paVar23) goto LAB_018b91d8;
  cVar31 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
           [(long)paVar23];
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  if ((cVar31 != '0') &&
     (in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1,
     paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0, cVar31 != '1')) goto LAB_018b9355;
  pcVar28 = (char *)((long)paVar23 + 1);
  paVar29 = paVar30;
  if ((((paVar30 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar28) &&
       (paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar28,
       ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))[(long)pcVar28]
       == '_')) &&
      ((paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar23 + 2), paVar30 == paVar29 ||
       ((((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
         [(long)paVar29] & 0xfe) != 0x30)))) || (0x3fffffffffffffff < (long)paVar41))
  goto LAB_018b934d;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)in_R10 + (long)paVar41 * 2);
  paVar23 = paVar29;
  goto LAB_018b7c16;
LAB_018b91d8:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                    ((IntegerDecimalCastData<unsigned_int> *)&dummy_value);
  goto LAB_018b9341;
LAB_018b72b8:
  if (pcVar28 == pcVar14) goto LAB_018b85e2;
  bVar35 = pcVar14[(long)(&((BaseScanner *)this_02._M_p)->states + -0x20)];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    _dummy_value = (pointer)paVar41;
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b9355;
    pbVar39 = (byte *)(pcVar14 + (long)(&pBVar24->states + -0x20));
    goto LAB_018b8777;
  }
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  if ((long)(((ulong)bVar5 ^ 0x7ffffffffffffffe) / 10) < (long)paVar41) goto LAB_018b9355;
  pcVar14 = pcVar14 + 1;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 10 + (ulong)bVar5);
  goto LAB_018b72b8;
LAB_018b8777:
  pcVar14 = pcVar14 + 1;
  if (pcVar28 <= pcVar14) goto LAB_018b85e2;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b934d;
  pbVar39 = pbVar39 + 1;
  goto LAB_018b8777;
LAB_018b85e2:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                    ((IntegerDecimalCastData<unsigned_int> *)&dummy_value);
  goto joined_r0x018b904a;
LAB_018b6c05:
  if (paVar29 <= paVar23) goto LAB_018b9321;
  bVar35 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
           [(long)paVar23];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  if (!bVar4) goto LAB_018b934d;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  pcVar28 = (char *)((long)paVar23 + 1);
  paVar30 = paVar29;
  if ((((paVar29 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar28) &&
       (paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar28,
       ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))[(long)pcVar28]
       == '_')) &&
      ((paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar23 + 2), paVar29 == paVar30 ||
       (bVar4 = StringUtil::CharacterIsHex
                          (((undefined1 *)
                           ((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
                           [(long)paVar30]), !bVar4)))) ||
     ((long)((ulong)((byte)(cVar31 + bVar5) >> 4) ^ 0x7ffffffffffffff) < (long)paVar41))
  goto LAB_018b934d;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 0x10 + (ulong)(byte)(cVar31 + bVar5));
  paVar23 = paVar30;
  goto LAB_018b6c05;
LAB_018b9321:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                    ((IntegerDecimalCastData<unsigned_int> *)&dummy_value);
  goto LAB_018b9341;
LAB_018b550e:
  if (pcVar14 <= pcVar40 + -1) goto LAB_018b6862;
  bVar35 = ((undefined1 *)((long)&pBVar38[-1].bytes_read + 7))[(long)pcVar40];
  if (9 < (byte)(bVar35 - 0x30)) {
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b7d21;
    pbVar39 = (byte *)(pcVar40 + (long)(&pBVar38->states + -0x20));
    goto LAB_018b6ff0;
  }
  pcVar40 = pcVar40 + 1;
  goto LAB_018b550e;
LAB_018b6862:
  if (pcVar14 == (char *)0x1) goto LAB_018b7d21;
  goto LAB_018b9355;
LAB_018b6ff0:
  if (pcVar14 <= pcVar40) goto LAB_018b9355;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b7d21;
  pbVar39 = pbVar39 + 1;
  pcVar40 = pcVar40 + 1;
  goto LAB_018b6ff0;
LAB_018b74e7:
  if (paVar29 <= paVar41) goto LAB_018b78c1;
  cVar31 = ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar41];
  if (cVar31 == '0') {
    sVar25 = 0;
  }
  else {
    if (cVar31 != '1') goto LAB_018b7d21;
    sVar25 = 1;
  }
  pcVar14 = (char *)((long)paVar41 + 1);
  paVar23 = paVar29;
  if ((((paVar29 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar14) &&
       (paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar14,
       ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)pcVar14] == '_')) &&
      ((paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar41 + 2), paVar29 == paVar23 ||
       ((((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar23] & 0xfe) != 0x30))))
     || (paVar41 = paVar23, sVar8 < 0)) goto LAB_018b7d21;
  sVar8 = sVar25 + sVar8 * 2;
  goto LAB_018b74e7;
LAB_018b68cd:
  if (pcVar14 == pcVar40) goto LAB_018b9355;
  bVar35 = pcVar40[(long)(&pBVar38->states + -0x20)];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b7d21;
    pbVar39 = (byte *)(pcVar40 + (long)(&pBVar22->states + -0x20));
    goto LAB_018b7954;
  }
  if ((ushort)~(ushort)bVar5 / 10 < uVar33) goto LAB_018b7d21;
  pcVar40 = pcVar40 + 1;
  uVar33 = (ushort)bVar5 + uVar33 * 10;
  goto LAB_018b68cd;
LAB_018b7954:
  pcVar40 = pcVar40 + 1;
  if (pcVar14 <= pcVar40) goto LAB_018b9355;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b7d21;
  pbVar39 = pbVar39 + 1;
  goto LAB_018b7954;
LAB_018b5f1a:
  if (paVar29 <= paVar41) goto LAB_018b78c1;
  bVar35 = ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar41];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  local_138 = paVar41;
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  if (!bVar4) goto LAB_018b7d21;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  pcVar14 = (char *)((long)local_138 + 1);
  paVar41 = paVar29;
  if (((paVar29 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar14) &&
      (paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pcVar14,
      ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)pcVar14] == '_')) &&
     ((pcVar14 = (char *)((long)local_138 + 2),
      paVar29 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar14 ||
      (local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pcVar14,
      bVar4 = StringUtil::CharacterIsHex
                        (((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)pcVar14]),
      paVar41 = local_138, !bVar4)))) goto LAB_018b7d21;
  if ((ushort)((byte)(cVar31 + bVar5) >> 4 ^ 0xfff) < (ushort)local_130) goto LAB_018b7d21;
  local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_130._4_4_,(uint)local_130 * 0x10 + (uint)(byte)(cVar31 + bVar5));
  goto LAB_018b5f1a;
LAB_018b78c1:
  paVar29 = local_140;
  if (paVar41 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x2) {
LAB_018b7d21:
    do {
      pBVar24 = (BaseScanner *)((long)&pBVar24->_vptr_BaseScanner + 1);
      if (pcVar28 == (char *)0x0) goto LAB_018b934d;
      bVar35 = *(byte *)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner;
      if ((0x20 < (ulong)bVar35) || ((0x100003e00U >> ((ulong)bVar35 & 0x3f) & 1) == 0)) {
        _dummy_value = (pointer)0x0;
        paStack_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_118[0]._M_allocated_capacity = 0;
        if (bVar35 == 0x2d) {
          pcVar14 = (char *)0x2;
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          goto LAB_018b7d6a;
        }
        if ((pcVar28 == (char *)0x1) || (bVar35 != 0x30)) {
          if (bVar35 != 0x2b) {
LAB_018b7ece:
            paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
            pcVar14 = (char *)0x0;
            goto LAB_018b7ed2;
          }
          goto LAB_018b934d;
        }
        cVar31 = *(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
        if (cVar31 == 'B') {
LAB_018b7f73:
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar28 + -1);
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          goto LAB_018b7f7e;
        }
        if (cVar31 != 'x') {
          if (cVar31 == 'b') goto LAB_018b7f73;
          if (cVar31 != 'X') {
            if (9 < (byte)(cVar31 - 0x30U)) goto LAB_018b7ece;
            goto LAB_018b934d;
          }
        }
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar28 + -1);
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
        goto LAB_018b7e05;
      }
      this_02._M_p = (pointer)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
      pcVar28 = pcVar28 + -1;
    } while( true );
  }
  goto LAB_018b9355;
LAB_018b7d6a:
  if (pcVar28 <= pcVar14 + -1) goto LAB_018b7eb5;
  bVar35 = ((undefined1 *)((long)&((BaseScanner *)((long)this_02._M_p + -0xd0))->bytes_read + 7))
           [(long)pcVar14];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    _dummy_value = (pointer)paVar41;
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b9355;
    pbVar39 = (byte *)(pcVar14 + (long)(&((BaseScanner *)this_02._M_p)->states + -0x20));
    goto LAB_018b7f3d;
  }
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  uVar34 = (0x8000000000000000 - (ulong)bVar5) / 10;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  if (SBORROW8((long)paVar41,-uVar34) != (long)(paVar41->_M_local_buf + uVar34) < 0)
  goto LAB_018b9355;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 10 - (ulong)bVar5);
  pcVar14 = pcVar14 + 1;
  goto LAB_018b7d6a;
LAB_018b7eb5:
  bVar4 = pcVar28 != (char *)0x1;
  goto LAB_018b7f64;
LAB_018b7f3d:
  if (pcVar28 <= pcVar14) goto LAB_018b7f62;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b934d;
  pbVar39 = pbVar39 + 1;
  pcVar14 = pcVar14 + 1;
  goto LAB_018b7f3d;
LAB_018b7f62:
  bVar4 = true;
LAB_018b7f64:
  _dummy_value = (pointer)paVar41;
  bVar7 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,true>
                    ((IntegerDecimalCastData<unsigned_short> *)&dummy_value);
  goto LAB_018b9048;
LAB_018b7f7e:
  if (paVar30 <= paVar23) goto LAB_018b91b4;
  cVar31 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
           [(long)paVar23];
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  if ((cVar31 != '0') &&
     (in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1,
     paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0, cVar31 != '1')) goto LAB_018b9355;
  pcVar28 = (char *)((long)paVar23 + 1);
  paVar29 = paVar30;
  if ((((paVar30 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar28) &&
       (paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar28,
       ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))[(long)pcVar28]
       == '_')) &&
      ((paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar23 + 2), paVar30 == paVar29 ||
       ((((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
         [(long)paVar29] & 0xfe) != 0x30)))) || (0x3fffffffffffffff < (long)paVar41))
  goto LAB_018b934d;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)in_R10 + (long)paVar41 * 2);
  paVar23 = paVar29;
  goto LAB_018b7f7e;
LAB_018b91b4:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::
          Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                    ((IntegerDecimalCastData<unsigned_short> *)&dummy_value);
  goto LAB_018b9341;
LAB_018b7ed2:
  if (pcVar28 == pcVar14) goto LAB_018b85ba;
  bVar35 = pcVar14[(long)(&((BaseScanner *)this_02._M_p)->states + -0x20)];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    _dummy_value = (pointer)paVar41;
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b9355;
    pbVar39 = (byte *)(pcVar14 + (long)(&pBVar24->states + -0x20));
    goto LAB_018b86d3;
  }
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  if ((long)(((ulong)bVar5 ^ 0x7ffffffffffffffe) / 10) < (long)paVar41) goto LAB_018b9355;
  pcVar14 = pcVar14 + 1;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 10 + (ulong)bVar5);
  goto LAB_018b7ed2;
LAB_018b86d3:
  pcVar14 = pcVar14 + 1;
  if (pcVar28 <= pcVar14) goto LAB_018b85ba;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b934d;
  pbVar39 = pbVar39 + 1;
  goto LAB_018b86d3;
LAB_018b85ba:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::
          Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                    ((IntegerDecimalCastData<unsigned_short> *)&dummy_value);
  goto joined_r0x018b904a;
LAB_018b7e05:
  if (paVar29 <= paVar23) goto LAB_018b9303;
  bVar35 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
           [(long)paVar23];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  if (!bVar4) goto LAB_018b934d;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  pcVar28 = (char *)((long)paVar23 + 1);
  paVar30 = paVar29;
  if ((((paVar29 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar28) &&
       (paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar28,
       ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))[(long)pcVar28]
       == '_')) &&
      ((paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar23 + 2), paVar29 == paVar30 ||
       (bVar4 = StringUtil::CharacterIsHex
                          (((undefined1 *)
                           ((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
                           [(long)paVar30]), !bVar4)))) ||
     ((long)((ulong)((byte)(cVar31 + bVar5) >> 4) ^ 0x7ffffffffffffff) < (long)paVar41))
  goto LAB_018b934d;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 0x10 + (ulong)(byte)(cVar31 + bVar5));
  paVar23 = paVar30;
  goto LAB_018b7e05;
LAB_018b9303:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::
          Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                    ((IntegerDecimalCastData<unsigned_short> *)&dummy_value);
  goto LAB_018b9341;
LAB_018b55e3:
  if (pcVar14 <= pcVar40 + -1) goto LAB_018b6871;
  bVar35 = ((undefined1 *)((long)&pBVar38[-1].bytes_read + 7))[(long)pcVar40];
  if (9 < (byte)(bVar35 - 0x30)) {
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b800f;
    pbVar39 = (byte *)(pcVar40 + (long)(&pBVar38->states + -0x20));
    goto LAB_018b703c;
  }
  pcVar40 = pcVar40 + 1;
  goto LAB_018b55e3;
LAB_018b6871:
  if (pcVar14 == (char *)0x1) goto LAB_018b800f;
  goto LAB_018b9355;
LAB_018b703c:
  if (pcVar14 <= pcVar40) goto LAB_018b9355;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b800f;
  pbVar39 = pbVar39 + 1;
  pcVar40 = pcVar40 + 1;
  goto LAB_018b703c;
LAB_018b7562:
  if (paVar29 <= paVar41) goto LAB_018b78d0;
  cVar31 = ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar41];
  if (cVar31 == '0') {
    bVar5 = 0;
  }
  else {
    if (cVar31 != '1') goto LAB_018b800f;
    bVar5 = 1;
  }
  pcVar14 = (char *)((long)paVar41 + 1);
  paVar23 = paVar29;
  if ((((paVar29 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar14) &&
       (paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar14,
       ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)pcVar14] == '_')) &&
      ((paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar41 + 2), paVar29 == paVar23 ||
       ((((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar23] & 0xfe) != 0x30))))
     || (paVar41 = paVar23, (char)bVar35 < '\0')) goto LAB_018b800f;
  bVar35 = bVar5 | bVar35 * '\x02';
  goto LAB_018b7562;
LAB_018b691c:
  if (pcVar14 == pcVar40) goto LAB_018b9355;
  bVar5 = pcVar40[(long)(&pBVar38->states + -0x20)];
  if (9 < (byte)(bVar5 - 0x30)) {
    if ((0x20 < bVar5) || ((0x100003e00U >> ((ulong)(uint)bVar5 & 0x3f) & 1) == 0))
    goto LAB_018b800f;
    pbVar39 = (byte *)(pcVar40 + (long)(&pBVar22->states + -0x20));
    goto LAB_018b799e;
  }
  if ((byte)(0x2f - bVar5) / 10 < bVar35) goto LAB_018b800f;
  pcVar40 = pcVar40 + 1;
  bVar35 = (bVar5 - 0x30) + bVar35 * '\n';
  goto LAB_018b691c;
LAB_018b799e:
  pcVar40 = pcVar40 + 1;
  if (pcVar14 <= pcVar40) goto LAB_018b9355;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b800f;
  pbVar39 = pbVar39 + 1;
  goto LAB_018b799e;
LAB_018b6028:
  if (paVar29 <= paVar41) goto LAB_018b78d0;
  bVar35 = ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar41];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  local_138 = paVar41;
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  if (!bVar4) goto LAB_018b800f;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  pcVar14 = (char *)((long)local_138 + 1);
  paVar41 = paVar29;
  if (((paVar29 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar14) &&
      (paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pcVar14,
      ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)pcVar14] == '_')) &&
     ((pcVar14 = (char *)((long)local_138 + 2),
      paVar29 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar14 ||
      (local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pcVar14,
      bVar4 = StringUtil::CharacterIsHex
                        (((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)pcVar14]),
      paVar41 = local_138, !bVar4)))) goto LAB_018b800f;
  if ((byte)~(cVar31 + bVar5) >> 4 < (byte)local_130) goto LAB_018b800f;
  local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_130._4_4_,(uint)(byte)(cVar31 + bVar5 + (byte)local_130 * '\x10'));
  goto LAB_018b6028;
LAB_018b78d0:
  paVar29 = local_140;
  if (paVar41 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x2) {
LAB_018b800f:
    do {
      pBVar24 = (BaseScanner *)((long)&pBVar24->_vptr_BaseScanner + 1);
      if (pcVar28 == (char *)0x0) goto LAB_018b934d;
      bVar35 = *(byte *)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner;
      if ((0x20 < (ulong)bVar35) || ((0x100003e00U >> ((ulong)bVar35 & 0x3f) & 1) == 0)) {
        _dummy_value = (pointer)0x0;
        paStack_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_118[0]._M_allocated_capacity = 0;
        if (bVar35 == 0x2d) {
          pcVar14 = (char *)0x2;
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          goto LAB_018b8058;
        }
        if ((pcVar28 == (char *)0x1) || (bVar35 != 0x30)) {
          if (bVar35 != 0x2b) {
LAB_018b81bc:
            paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
            pcVar14 = (char *)0x0;
            goto LAB_018b81c0;
          }
          goto LAB_018b934d;
        }
        cVar31 = *(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
        if (cVar31 == 'B') {
LAB_018b8261:
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar28 + -1);
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          goto LAB_018b826c;
        }
        if (cVar31 != 'x') {
          if (cVar31 == 'b') goto LAB_018b8261;
          if (cVar31 != 'X') {
            if (9 < (byte)(cVar31 - 0x30U)) goto LAB_018b81bc;
            goto LAB_018b934d;
          }
        }
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar28 + -1);
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
        goto LAB_018b80f3;
      }
      this_02._M_p = (pointer)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
      pcVar28 = pcVar28 + -1;
    } while( true );
  }
  goto LAB_018b9355;
LAB_018b8058:
  if (pcVar28 <= pcVar14 + -1) goto LAB_018b81a3;
  bVar35 = ((undefined1 *)((long)&((BaseScanner *)((long)this_02._M_p + -0xd0))->bytes_read + 7))
           [(long)pcVar14];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    _dummy_value = (pointer)paVar41;
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b9355;
    pbVar39 = (byte *)(pcVar14 + (long)(&((BaseScanner *)this_02._M_p)->states + -0x20));
    goto LAB_018b822b;
  }
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  uVar34 = (0x8000000000000000 - (ulong)bVar5) / 10;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  if (SBORROW8((long)paVar41,-uVar34) != (long)(paVar41->_M_local_buf + uVar34) < 0)
  goto LAB_018b9355;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 10 - (ulong)bVar5);
  pcVar14 = pcVar14 + 1;
  goto LAB_018b8058;
LAB_018b81a3:
  bVar4 = pcVar28 != (char *)0x1;
  goto LAB_018b8252;
LAB_018b822b:
  if (pcVar28 <= pcVar14) goto LAB_018b8250;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b934d;
  pbVar39 = pbVar39 + 1;
  pcVar14 = pcVar14 + 1;
  goto LAB_018b822b;
LAB_018b8250:
  bVar4 = true;
LAB_018b8252:
  _dummy_value = (pointer)paVar41;
  bVar7 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,true>
                    ((IntegerDecimalCastData<unsigned_char> *)&dummy_value);
  goto LAB_018b9048;
LAB_018b826c:
  if (paVar30 <= paVar23) goto LAB_018b91c6;
  cVar31 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
           [(long)paVar23];
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  if ((cVar31 != '0') &&
     (in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1,
     paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0, cVar31 != '1')) goto LAB_018b9355;
  pcVar28 = (char *)((long)paVar23 + 1);
  paVar29 = paVar30;
  if ((((paVar30 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar28) &&
       (paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar28,
       ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))[(long)pcVar28]
       == '_')) &&
      ((paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar23 + 2), paVar30 == paVar29 ||
       ((((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
         [(long)paVar29] & 0xfe) != 0x30)))) || (0x3fffffffffffffff < (long)paVar41))
  goto LAB_018b934d;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)in_R10 + (long)paVar41 * 2);
  paVar23 = paVar29;
  goto LAB_018b826c;
LAB_018b91c6:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                    ((IntegerDecimalCastData<unsigned_char> *)&dummy_value);
  goto LAB_018b9341;
LAB_018b81c0:
  if (pcVar28 == pcVar14) goto LAB_018b85ce;
  bVar35 = pcVar14[(long)(&((BaseScanner *)this_02._M_p)->states + -0x20)];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    _dummy_value = (pointer)paVar41;
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b9355;
    pbVar39 = (byte *)(pcVar14 + (long)(&pBVar24->states + -0x20));
    goto LAB_018b8725;
  }
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  if ((long)(((ulong)bVar5 ^ 0x7ffffffffffffffe) / 10) < (long)paVar41) goto LAB_018b9355;
  pcVar14 = pcVar14 + 1;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 10 + (ulong)bVar5);
  goto LAB_018b81c0;
LAB_018b8725:
  pcVar14 = pcVar14 + 1;
  if (pcVar28 <= pcVar14) goto LAB_018b85ce;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b934d;
  pbVar39 = pbVar39 + 1;
  goto LAB_018b8725;
LAB_018b85ce:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                    ((IntegerDecimalCastData<unsigned_char> *)&dummy_value);
  goto joined_r0x018b904a;
LAB_018b80f3:
  if (paVar29 <= paVar23) goto LAB_018b9312;
  bVar35 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
           [(long)paVar23];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  if (!bVar4) goto LAB_018b934d;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  pcVar28 = (char *)((long)paVar23 + 1);
  paVar30 = paVar29;
  if ((((paVar29 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar28) &&
       (paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar28,
       ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))[(long)pcVar28]
       == '_')) &&
      ((paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar23 + 2), paVar29 == paVar30 ||
       (bVar4 = StringUtil::CharacterIsHex
                          (((undefined1 *)
                           ((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
                           [(long)paVar30]), !bVar4)))) ||
     ((long)((ulong)((byte)(cVar31 + bVar5) >> 4) ^ 0x7ffffffffffffff) < (long)paVar41))
  goto LAB_018b934d;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 0x10 + (ulong)(byte)(cVar31 + bVar5));
  paVar23 = paVar30;
  goto LAB_018b80f3;
LAB_018b9312:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                    ((IntegerDecimalCastData<unsigned_char> *)&dummy_value);
  goto LAB_018b9341;
LAB_018b572b:
  if (pcVar14 <= pcVar40 + -1) goto LAB_018b689e;
  bVar35 = ((undefined1 *)((long)&pBVar38[-1].bytes_read + 7))[(long)pcVar40];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b6976;
    pbVar39 = (byte *)(pcVar40 + (long)(&pBVar38->states + -0x20));
    goto LAB_018b7120;
  }
  uVar34 = (0x8000000000000000 - (ulong)bVar5) / 10;
  if (SBORROW8(lVar13,-uVar34) != (long)(lVar13 + uVar34) < 0) goto LAB_018b6976;
  lVar13 = lVar13 * 10 - (ulong)bVar5;
  pcVar40 = pcVar40 + 1;
  goto LAB_018b572b;
LAB_018b689e:
  if (pcVar14 == (char *)0x1) goto LAB_018b6976;
  goto LAB_018b9355;
LAB_018b7120:
  if (pcVar14 <= pcVar40) goto LAB_018b9355;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b6976;
  pbVar39 = pbVar39 + 1;
  pcVar40 = pcVar40 + 1;
  goto LAB_018b7120;
LAB_018b766e:
  if (paVar29 <= paVar41) goto joined_r0x018b7acb;
  cVar31 = ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar41];
  if (cVar31 == '0') {
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  }
  else {
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x1;
    if (cVar31 != '1') goto LAB_018b6976;
  }
  paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(paVar41->_M_local_buf + 1);
  paVar27 = paVar29;
  if ((((paVar29 != paVar30) &&
       (paVar27 = paVar30,
       ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar30] == '_')) &&
      ((paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar41->_M_local_buf + 2), paVar29 == paVar27 ||
       ((((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar27] & 0xfe) != 0x30))))
     || (paVar41 = paVar27, 0x3fffffffffffffff < (long)pcVar14)) goto LAB_018b6976;
  pcVar14 = paVar23->_M_local_buf + (long)pcVar14 * 2;
  goto LAB_018b766e;
LAB_018b82f7:
  if (pcVar14 == pcVar40) goto LAB_018b9355;
  bVar35 = pcVar40[(long)(&pBVar38->states + -0x20)];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b6976;
    pbVar39 = (byte *)(pcVar40 + (long)(&pBVar22->states + -0x20));
    goto LAB_018b835d;
  }
  if ((long)(((ulong)bVar5 ^ 0x7ffffffffffffffe) / 10) < lVar13) goto LAB_018b6976;
  pcVar40 = pcVar40 + 1;
  lVar13 = lVar13 * 10 + (ulong)bVar5;
  goto LAB_018b82f7;
LAB_018b835d:
  pcVar40 = pcVar40 + 1;
  if (pcVar14 <= pcVar40) goto LAB_018b9355;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b6976;
  pbVar39 = pbVar39 + 1;
  goto LAB_018b835d;
LAB_018b624c:
  if (paVar29 <= paVar41) goto joined_r0x018b7acb;
  bVar35 = ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar41];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  local_138 = paVar41;
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  if (!bVar4) goto LAB_018b6976;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  pcVar14 = (char *)((long)local_138 + 1);
  paVar41 = paVar29;
  if ((((paVar29 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar14) &&
       (paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar14,
       ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)pcVar14] == '_')) &&
      ((pcVar14 = (char *)((long)local_138 + 2),
       paVar29 ==
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar14 ||
       (local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar14,
       bVar4 = StringUtil::CharacterIsHex
                         (((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)pcVar14]),
       paVar41 = local_138, !bVar4)))) ||
     ((long)((ulong)((byte)(cVar31 + bVar5) >> 4) ^ 0x7ffffffffffffff) < (long)local_130))
  goto LAB_018b6976;
  local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)local_130 * 0x10 + (ulong)(byte)(cVar31 + bVar5));
  goto LAB_018b624c;
joined_r0x018b7acb:
  paVar29 = local_140;
  if (paVar41 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x2) {
LAB_018b6976:
    do {
      pBVar24 = (BaseScanner *)((long)&pBVar24->_vptr_BaseScanner + 1);
      if (pcVar28 == (char *)0x0) goto LAB_018b934d;
      bVar35 = *(byte *)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner;
      if ((0x20 < (ulong)bVar35) || ((0x100003e00U >> ((ulong)bVar35 & 0x3f) & 1) == 0)) {
        _dummy_value = (pointer)0x0;
        paStack_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_118[0]._M_allocated_capacity = 0;
        if (bVar35 == 0x2d) {
          pcVar14 = (char *)0x2;
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          goto LAB_018b69bf;
        }
        if ((pcVar28 == (char *)0x1) || (bVar35 != 0x30)) {
          if (bVar35 != 0x2b) {
LAB_018b721a:
            paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
            pcVar14 = (char *)0x0;
            goto LAB_018b721e;
          }
          goto LAB_018b934d;
        }
        cVar31 = *(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
        if (cVar31 == 'B') {
LAB_018b7b03:
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar28 + -1);
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          goto LAB_018b7b0e;
        }
        if (cVar31 != 'x') {
          if (cVar31 == 'b') goto LAB_018b7b03;
          if (cVar31 != 'X') {
            if (9 < (byte)(cVar31 - 0x30U)) goto LAB_018b721a;
            goto LAB_018b934d;
          }
        }
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar28 + -1);
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
        goto LAB_018b6a5a;
      }
      this_02._M_p = (pointer)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
      pcVar28 = pcVar28 + -1;
    } while( true );
  }
  goto LAB_018b9355;
LAB_018b69bf:
  if (pcVar28 <= pcVar14 + -1) goto LAB_018b71df;
  bVar35 = ((undefined1 *)((long)&((BaseScanner *)((long)this_02._M_p + -0xd0))->bytes_read + 7))
           [(long)pcVar14];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    _dummy_value = (pointer)paVar41;
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b9355;
    pbVar39 = (byte *)(pcVar14 + (long)(&((BaseScanner *)this_02._M_p)->states + -0x20));
    goto LAB_018b73c7;
  }
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  uVar34 = (0x8000000000000000 - (ulong)bVar5) / 10;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  if (SBORROW8((long)paVar41,-uVar34) != (long)(paVar41->_M_local_buf + uVar34) < 0)
  goto LAB_018b9355;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 10 - (ulong)bVar5);
  pcVar14 = pcVar14 + 1;
  goto LAB_018b69bf;
LAB_018b71df:
  bVar4 = pcVar28 != (char *)0x1;
  goto LAB_018b7901;
LAB_018b73c7:
  if (pcVar28 <= pcVar14) goto LAB_018b78ff;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b934d;
  pbVar39 = pbVar39 + 1;
  pcVar14 = pcVar14 + 1;
  goto LAB_018b73c7;
LAB_018b78ff:
  bVar4 = true;
LAB_018b7901:
  _dummy_value = (pointer)paVar41;
  bVar7 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,true>
                    ((IntegerDecimalCastData<long> *)&dummy_value);
  goto LAB_018b9048;
LAB_018b7b0e:
  if (paVar30 <= paVar23) goto LAB_018b9190;
  cVar31 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
           [(long)paVar23];
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  if ((cVar31 != '0') &&
     (in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1,
     paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0, cVar31 != '1')) goto LAB_018b9355;
  pcVar28 = (char *)((long)paVar23 + 1);
  paVar29 = paVar30;
  if ((((paVar30 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar28) &&
       (paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar28,
       ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))[(long)pcVar28]
       == '_')) &&
      ((paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar23 + 2), paVar30 == paVar29 ||
       ((((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
         [(long)paVar29] & 0xfe) != 0x30)))) || (0x3fffffffffffffff < (long)paVar41))
  goto LAB_018b934d;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)in_R10 + (long)paVar41 * 2);
  paVar23 = paVar29;
  goto LAB_018b7b0e;
LAB_018b9190:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                    ((IntegerDecimalCastData<long> *)&dummy_value);
  goto LAB_018b9341;
LAB_018b721e:
  if (pcVar28 == pcVar14) goto LAB_018b8592;
  bVar35 = pcVar14[(long)(&((BaseScanner *)this_02._M_p)->states + -0x20)];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    _dummy_value = (pointer)paVar41;
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b9355;
    pbVar39 = (byte *)(pcVar14 + (long)(&pBVar24->states + -0x20));
    goto LAB_018b862f;
  }
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  if ((long)(((ulong)bVar5 ^ 0x7ffffffffffffffe) / 10) < (long)paVar41) goto LAB_018b9355;
  pcVar14 = pcVar14 + 1;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 10 + (ulong)bVar5);
  goto LAB_018b721e;
LAB_018b862f:
  pcVar14 = pcVar14 + 1;
  if (pcVar28 <= pcVar14) goto LAB_018b8592;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b934d;
  pbVar39 = pbVar39 + 1;
  goto LAB_018b862f;
LAB_018b8592:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                    ((IntegerDecimalCastData<long> *)&dummy_value);
  goto joined_r0x018b904a;
LAB_018b6a5a:
  if (paVar29 <= paVar23) goto LAB_018b92e5;
  bVar35 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
           [(long)paVar23];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  if (!bVar4) goto LAB_018b934d;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  pcVar28 = (char *)((long)paVar23 + 1);
  paVar30 = paVar29;
  if ((((paVar29 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar28) &&
       (paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar28,
       ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))[(long)pcVar28]
       == '_')) &&
      ((paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar23 + 2), paVar29 == paVar30 ||
       (bVar4 = StringUtil::CharacterIsHex
                          (((undefined1 *)
                           ((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
                           [(long)paVar30]), !bVar4)))) ||
     ((long)((ulong)((byte)(cVar31 + bVar5) >> 4) ^ 0x7ffffffffffffff) < (long)paVar41))
  goto LAB_018b934d;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 0x10 + (ulong)(byte)(cVar31 + bVar5));
  paVar23 = paVar30;
  goto LAB_018b6a5a;
LAB_018b92e5:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                    ((IntegerDecimalCastData<long> *)&dummy_value);
  goto LAB_018b9341;
LAB_018b5982:
  if (pcVar14 <= pcVar40 + -1) goto LAB_018b68ad;
  bVar35 = ((undefined1 *)((long)&pBVar38[-1].bytes_read + 7))[(long)pcVar40];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b6e3a;
    pbVar39 = (byte *)(pcVar40 + (long)(&pBVar38->states + -0x20));
    goto LAB_018b716c;
  }
  uVar9 = (0x80000000 - bVar5) / 10;
  if (SBORROW4(iVar21,-uVar9) != (int)(iVar21 + uVar9) < 0) goto LAB_018b6e3a;
  iVar21 = iVar21 * 10 - (uint)bVar5;
  pcVar40 = pcVar40 + 1;
  goto LAB_018b5982;
LAB_018b68ad:
  if (pcVar14 == (char *)0x1) goto LAB_018b6e3a;
  goto LAB_018b9355;
LAB_018b716c:
  if (pcVar14 <= pcVar40) goto LAB_018b9355;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b6e3a;
  pbVar39 = pbVar39 + 1;
  pcVar40 = pcVar40 + 1;
  goto LAB_018b716c;
LAB_018b77e1:
  if (paVar29 <= paVar41) goto joined_r0x018b7af8;
  cVar31 = ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar41];
  iVar32 = 0;
  if (cVar31 != '0') {
    if (cVar31 != '1') goto LAB_018b6e3a;
    iVar32 = 1;
  }
  paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(paVar41->_M_local_buf + 1);
  paVar30 = paVar29;
  if ((((paVar29 != paVar23) &&
       (paVar30 = paVar23,
       ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar23] == '_')) &&
      ((paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar41->_M_local_buf + 2), paVar29 == paVar30 ||
       ((((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar30] & 0xfe) != 0x30))))
     || (paVar41 = paVar30, 0x3fffffff < iVar21)) goto LAB_018b6e3a;
  iVar21 = iVar32 + iVar21 * 2;
  goto LAB_018b77e1;
LAB_018b84bd:
  if (pcVar14 == pcVar40) goto LAB_018b9355;
  bVar35 = pcVar40[(long)(&pBVar38->states + -0x20)];
  uVar9 = bVar35 - 0x30;
  if (9 < (byte)uVar9) {
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b6e3a;
    pbVar39 = (byte *)(pcVar40 + (long)(&pBVar22->states + -0x20));
    goto LAB_018b851a;
  }
  if ((int)(((ulong)uVar9 & 0xffffffff000000ff ^ 0x7ffffffe) / 10) < iVar21) goto LAB_018b6e3a;
  pcVar40 = pcVar40 + 1;
  iVar21 = iVar21 * 10 + (uVar9 & 0xff);
  goto LAB_018b84bd;
LAB_018b851a:
  pcVar40 = pcVar40 + 1;
  if (pcVar14 <= pcVar40) goto LAB_018b9355;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b6e3a;
  pbVar39 = pbVar39 + 1;
  goto LAB_018b851a;
LAB_018b65b0:
  if (paVar29 <= paVar41) goto joined_r0x018b7af8;
  bVar35 = ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)paVar41];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  local_138 = paVar41;
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  if (!bVar4) goto LAB_018b6e3a;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  pcVar14 = (char *)((long)local_138 + 1);
  paVar41 = paVar29;
  if (((paVar29 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar14) &&
      (paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pcVar14,
      ((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)pcVar14] == '_')) &&
     ((pcVar14 = (char *)((long)local_138 + 2),
      paVar29 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar14 ||
      (local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pcVar14,
      bVar4 = StringUtil::CharacterIsHex
                        (((undefined1 *)((long)&pBVar38->_vptr_BaseScanner + 1))[(long)pcVar14]),
      paVar41 = local_138, !bVar4)))) goto LAB_018b6e3a;
  if ((int)((byte)(cVar31 + bVar5) >> 4 ^ 0x7ffffff) < (int)(uint)local_130) goto LAB_018b6e3a;
  local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_130._4_4_,(uint)local_130 * 0x10 + (uint)(byte)(cVar31 + bVar5));
  goto LAB_018b65b0;
joined_r0x018b7af8:
  paVar29 = local_140;
  if (paVar41 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x2) {
LAB_018b6e3a:
    do {
      pBVar24 = (BaseScanner *)((long)&pBVar24->_vptr_BaseScanner + 1);
      if (pcVar28 == (char *)0x0) goto LAB_018b934d;
      bVar35 = *(byte *)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner;
      if ((0x20 < (ulong)bVar35) || ((0x100003e00U >> ((ulong)bVar35 & 0x3f) & 1) == 0)) {
        _dummy_value = (pointer)0x0;
        paStack_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_118[0]._M_allocated_capacity = 0;
        if (bVar35 == 0x2d) {
          pcVar14 = (char *)0x2;
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          goto LAB_018b6e83;
        }
        if ((pcVar28 == (char *)0x1) || (bVar35 != 0x30)) {
          if (bVar35 != 0x2b) {
LAB_018b7267:
            paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
            pcVar14 = (char *)0x0;
            goto LAB_018b726b;
          }
          goto LAB_018b934d;
        }
        cVar31 = *(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
        if (cVar31 == 'B') {
LAB_018b7b87:
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar28 + -1);
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          goto LAB_018b7b92;
        }
        if (cVar31 != 'x') {
          if (cVar31 == 'b') goto LAB_018b7b87;
          if (cVar31 != 'X') {
            if (9 < (byte)(cVar31 - 0x30U)) goto LAB_018b7267;
            goto LAB_018b934d;
          }
        }
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar28 + -1);
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
        goto LAB_018b6f1e;
      }
      this_02._M_p = (pointer)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
      pcVar28 = pcVar28 + -1;
    } while( true );
  }
  goto LAB_018b9355;
LAB_018b6e83:
  if (pcVar28 <= pcVar14 + -1) goto LAB_018b71f0;
  bVar35 = ((undefined1 *)((long)&((BaseScanner *)((long)this_02._M_p + -0xd0))->bytes_read + 7))
           [(long)pcVar14];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    _dummy_value = (pointer)paVar41;
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b9355;
    pbVar39 = (byte *)(pcVar14 + (long)(&((BaseScanner *)this_02._M_p)->states + -0x20));
    goto LAB_018b741a;
  }
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  uVar34 = (0x8000000000000000 - (ulong)bVar5) / 10;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  if (SBORROW8((long)paVar41,-uVar34) != (long)(paVar41->_M_local_buf + uVar34) < 0)
  goto LAB_018b9355;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 10 - (ulong)bVar5);
  pcVar14 = pcVar14 + 1;
  goto LAB_018b6e83;
LAB_018b71f0:
  bVar4 = pcVar28 != (char *)0x1;
  goto LAB_018b7912;
LAB_018b741a:
  if (pcVar28 <= pcVar14) goto LAB_018b7910;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b934d;
  pbVar39 = pbVar39 + 1;
  pcVar14 = pcVar14 + 1;
  goto LAB_018b741a;
LAB_018b7910:
  bVar4 = true;
LAB_018b7912:
  _dummy_value = (pointer)paVar41;
  bVar7 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,true>
                    ((IntegerDecimalCastData<int> *)&dummy_value);
  goto LAB_018b9048;
LAB_018b7b92:
  if (paVar30 <= paVar23) goto LAB_018b91a2;
  cVar31 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
           [(long)paVar23];
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  if ((cVar31 != '0') &&
     (in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1,
     paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0, cVar31 != '1')) goto LAB_018b9355;
  pcVar28 = (char *)((long)paVar23 + 1);
  paVar29 = paVar30;
  if ((((paVar30 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar28) &&
       (paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar28,
       ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))[(long)pcVar28]
       == '_')) &&
      ((paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar23 + 2), paVar30 == paVar29 ||
       ((((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
         [(long)paVar29] & 0xfe) != 0x30)))) || (0x3fffffffffffffff < (long)paVar41))
  goto LAB_018b934d;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)in_R10 + (long)paVar41 * 2);
  paVar23 = paVar29;
  goto LAB_018b7b92;
LAB_018b91a2:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                    ((IntegerDecimalCastData<int> *)&dummy_value);
  goto LAB_018b9341;
LAB_018b726b:
  if (pcVar28 == pcVar14) goto LAB_018b85a6;
  bVar35 = pcVar14[(long)(&((BaseScanner *)this_02._M_p)->states + -0x20)];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    _dummy_value = (pointer)paVar41;
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b9355;
    pbVar39 = (byte *)(pcVar14 + (long)(&pBVar24->states + -0x20));
    goto LAB_018b8681;
  }
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  if ((long)(((ulong)bVar5 ^ 0x7ffffffffffffffe) / 10) < (long)paVar41) goto LAB_018b9355;
  pcVar14 = pcVar14 + 1;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 10 + (ulong)bVar5);
  goto LAB_018b726b;
LAB_018b8681:
  pcVar14 = pcVar14 + 1;
  if (pcVar28 <= pcVar14) goto LAB_018b85a6;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b934d;
  pbVar39 = pbVar39 + 1;
  goto LAB_018b8681;
LAB_018b85a6:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                    ((IntegerDecimalCastData<int> *)&dummy_value);
  goto joined_r0x018b904a;
LAB_018b6f1e:
  if (paVar29 <= paVar23) goto LAB_018b92f4;
  bVar35 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
           [(long)paVar23];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  if (!bVar4) goto LAB_018b934d;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  pcVar28 = (char *)((long)paVar23 + 1);
  paVar30 = paVar29;
  if ((((paVar29 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar28) &&
       (paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar28,
       ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))[(long)pcVar28]
       == '_')) &&
      ((paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar23 + 2), paVar29 == paVar30 ||
       (bVar4 = StringUtil::CharacterIsHex
                          (((undefined1 *)
                           ((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
                           [(long)paVar30]), !bVar4)))) ||
     ((long)((ulong)((byte)(cVar31 + bVar5) >> 4) ^ 0x7ffffffffffffff) < (long)paVar41))
  goto LAB_018b934d;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 0x10 + (ulong)(byte)(cVar31 + bVar5));
  paVar23 = paVar30;
  goto LAB_018b6f1e;
LAB_018b92f4:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                    ((IntegerDecimalCastData<int> *)&dummy_value);
  goto LAB_018b9341;
LAB_018b7a38:
  if (in_R10 <= paVar41) goto LAB_018b8dd5;
  pcVar40 = (char *)((long)paVar41 + (long)(&((BaseScanner *)this_02._M_p)->states + -0x20));
  if ((pcVar14 + 1)[(long)pcVar40] == '0') {
    sVar8 = 0;
  }
  else {
    if ((pcVar14 + 1)[(long)pcVar40] != '1') goto LAB_018b8e19;
    sVar8 = 1;
  }
  paVar29 = in_R10;
  if (pcVar28 + (-2 - (long)paVar41) != pcVar14) {
    if ((pcVar14 + 2)[(long)pcVar40] == '_') {
      if ((pcVar28 + (-3 - (long)paVar41) == pcVar14) ||
         (((pcVar14 + 3)[(long)pcVar40] & 0xfeU) != 0x30)) goto LAB_018b8e19;
      paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar41 + 2);
    }
    else {
      paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar41 + 1);
    }
  }
  paVar41 = paVar29;
  if (0x3fff < exponent.result) goto LAB_018b8e19;
  exponent.result = sVar8 + exponent.result * 2;
  goto LAB_018b7a38;
LAB_018b8dd5:
  uVar37 = (undefined7)((ulong)in_R10 >> 8);
  goto joined_r0x018b8ddc;
LAB_018b6767:
  if (local_138 <= paVar41) goto LAB_018b9253;
  local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)paVar41 + (long)(&((BaseScanner *)this_02._M_p)->states + -0x20));
  bVar35 = (pcVar14 + 1)[(long)local_130];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_140._4_4_,iVar21);
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  in_R10 = local_138;
  if (!bVar4) goto LAB_018b8e19;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  paVar29 = local_138;
  if (pcVar28 + (-2 - (long)paVar41) != pcVar14) {
    if ((pcVar14 + 2)[(long)local_130] == '_') {
      local_e0 = paVar41;
      if (pcVar28 + (-3 - (long)paVar41) == pcVar14) goto LAB_018b8e19;
      bVar4 = StringUtil::CharacterIsHex((pcVar14 + 3)[(long)local_130]);
      in_R10 = local_138;
      if (!bVar4) goto LAB_018b8e19;
      paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)local_e0 + 2);
    }
    else {
      paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar41 + 1);
    }
  }
  in_R10 = local_138;
  if ((short)((byte)(cVar31 + bVar5) >> 4 ^ 0x7ff) < (short)(int)local_140) goto LAB_018b8e19;
  iVar21 = (int)local_140 * 0x10 + (uint)(byte)(cVar31 + bVar5);
  exponent.result = (ResultType_conflict)iVar21;
  paVar41 = paVar29;
  goto LAB_018b6767;
LAB_018b9253:
  uVar37 = (undefined7)((ulong)local_138 >> 8);
joined_r0x018b8ddc:
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT71(uVar37,1);
  paVar29 = in_R10;
  if (paVar41 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x2) {
LAB_018b8e19:
    do {
      pBVar22 = (BaseScanner *)((long)&pBVar22->_vptr_BaseScanner + 1);
      if (pcVar28 == (char *)0x0) goto LAB_018b934d;
      bVar35 = *(byte *)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner;
      if ((0x20 < (ulong)bVar35) || ((0x100003e00U >> ((ulong)bVar35 & 0x3f) & 1) == 0)) {
        _dummy_value = (pointer)0x0;
        paStack_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_118[0]._M_allocated_capacity = 0;
        if (bVar35 == 0x2d) {
          pcVar14 = (char *)0x2;
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          goto LAB_018b8e54;
        }
        if ((pcVar28 == (char *)0x1) || (bVar35 != 0x30)) {
          if (bVar35 != 0x2b) {
LAB_018b8fb2:
            paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
            pcVar14 = (char *)0x0;
            goto LAB_018b8fb6;
          }
          goto LAB_018b934d;
        }
        cVar31 = *(char *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
        if (cVar31 == 'B') {
LAB_018b9055:
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar28 + -1);
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          goto LAB_018b9060;
        }
        if (cVar31 != 'x') {
          if (cVar31 == 'b') goto LAB_018b9055;
          if (cVar31 != 'X') {
            if (9 < (byte)(cVar31 - 0x30U)) goto LAB_018b8fb2;
            goto LAB_018b934d;
          }
        }
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar28 + -1);
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
        goto LAB_018b8ee3;
      }
      this_02._M_p = (pointer)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1);
      pcVar28 = pcVar28 + -1;
    } while( true );
  }
  goto LAB_018b9355;
LAB_018b8e54:
  if (pcVar28 <= pcVar14 + -1) goto LAB_018b8f99;
  bVar35 = ((undefined1 *)((long)&((BaseScanner *)((long)this_02._M_p + -0xd0))->bytes_read + 7))
           [(long)pcVar14];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    _dummy_value = (pointer)paVar41;
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b9355;
    pbVar39 = (byte *)(pcVar14 + (long)(&((BaseScanner *)this_02._M_p)->states + -0x20));
    goto LAB_018b9017;
  }
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  uVar34 = (0x8000000000000000 - (ulong)bVar5) / 10;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  if (SBORROW8((long)paVar41,-uVar34) != (long)(paVar41->_M_local_buf + uVar34) < 0)
  goto LAB_018b9355;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 10 - (ulong)bVar5);
  pcVar14 = pcVar14 + 1;
  goto LAB_018b8e54;
LAB_018b8f99:
  bVar4 = pcVar28 != (char *)0x1;
  goto LAB_018b903e;
LAB_018b9017:
  if (pcVar28 <= pcVar14) goto LAB_018b903c;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b934d;
  pbVar39 = pbVar39 + 1;
  pcVar14 = pcVar14 + 1;
  goto LAB_018b9017;
LAB_018b903c:
  bVar4 = true;
LAB_018b903e:
  _dummy_value = (pointer)paVar41;
  bVar7 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,true>
                    ((IntegerDecimalCastData<short> *)&dummy_value);
LAB_018b9048:
  bVar4 = (bool)(bVar4 & bVar7);
  goto joined_r0x018b904a;
LAB_018b9060:
  if (paVar30 <= paVar23) goto LAB_018b9159;
  cVar31 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
           [(long)paVar23];
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  if ((cVar31 != '0') &&
     (in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1,
     paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0, cVar31 != '1')) goto LAB_018b9355;
  pcVar28 = (char *)((long)paVar23 + 1);
  paVar29 = paVar30;
  if ((((paVar30 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar28) &&
       (paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar28,
       ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))[(long)pcVar28]
       == '_')) &&
      ((paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar23 + 2), paVar30 == paVar29 ||
       ((((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
         [(long)paVar29] & 0xfe) != 0x30)))) || (0x3fffffffffffffff < (long)paVar41))
  goto LAB_018b934d;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)in_R10 + (long)paVar41 * 2);
  paVar23 = paVar29;
  goto LAB_018b9060;
LAB_018b9159:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                    ((IntegerDecimalCastData<short> *)&dummy_value);
  goto LAB_018b9341;
LAB_018b8fb6:
  if (pcVar28 == pcVar14) goto LAB_018b90de;
  bVar35 = pcVar14[(long)(&((BaseScanner *)this_02._M_p)->states + -0x20)];
  bVar5 = bVar35 - 0x30;
  if (9 < bVar5) {
    in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    _dummy_value = (pointer)paVar41;
    if ((0x20 < bVar35) || ((0x100003e00U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))
    goto LAB_018b9355;
    pbVar39 = (byte *)(pcVar14 + (long)(&pBVar22->states + -0x20));
    goto LAB_018b9115;
  }
  in_R10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
  if ((long)(((ulong)bVar5 ^ 0x7ffffffffffffffe) / 10) < (long)paVar41) goto LAB_018b9355;
  pcVar14 = pcVar14 + 1;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar41 * 10 + (ulong)bVar5);
  goto LAB_018b8fb6;
LAB_018b9115:
  pcVar14 = pcVar14 + 1;
  if (pcVar28 <= pcVar14) goto LAB_018b90de;
  if ((0x20 < (ulong)*pbVar39) || ((0x100003e00U >> ((ulong)*pbVar39 & 0x3f) & 1) == 0))
  goto LAB_018b934d;
  pbVar39 = pbVar39 + 1;
  goto LAB_018b9115;
LAB_018b90de:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                    ((IntegerDecimalCastData<short> *)&dummy_value);
joined_r0x018b904a:
  if (bVar4 != false) goto LAB_018b9348;
  goto LAB_018b934d;
LAB_018b8ee3:
  if (paVar29 <= paVar23) goto LAB_018b9265;
  bVar35 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
           [(long)paVar23];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  if (!bVar4) goto LAB_018b934d;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  pcVar28 = (char *)((long)paVar23 + 1);
  paVar41 = paVar29;
  if ((((paVar29 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar28) &&
       (paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar28,
       ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))[(long)pcVar28]
       == '_')) &&
      ((paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar23 + 2), paVar29 == paVar41 ||
       (bVar4 = StringUtil::CharacterIsHex
                          (((undefined1 *)
                           ((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
                           [(long)paVar41]), !bVar4)))) ||
     ((long)((ulong)((byte)(cVar31 + bVar5) >> 4) ^ 0x7ffffffffffffff) < (long)_dummy_value))
  goto LAB_018b934d;
  _dummy_value = (pointer)((long)_dummy_value * 0x10 + (ulong)(byte)(cVar31 + bVar5));
  paVar23 = paVar41;
  goto LAB_018b8ee3;
LAB_018b9265:
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                    ((IntegerDecimalCastData<short> *)&dummy_value);
LAB_018b9341:
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x1 < paVar23 & bVar4) == 0) {
LAB_018b934d:
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  }
  else {
LAB_018b9348:
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71((int7)((ulong)in_R10 >> 8),1);
  }
  goto LAB_018b9355;
LAB_018b564d:
  paVar30 = paVar41;
  if (paVar23 <= paVar30) goto joined_r0x018b8546;
  pcVar14 = (char *)((long)&((BaseScanner *)(&((BaseScanner *)this_02._M_p)->states + -0x20))->
                            _vptr_BaseScanner + (long)paVar30->_M_local_buf);
  bVar35 = paVar29->_M_local_buf[(long)pcVar14];
  if (9 < (byte)(bVar35 - 0x30)) {
    if (bVar35 == 0x2e) {
      if (paVar23 <=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(paVar30->_M_local_buf + 1)) goto joined_r0x018b8546;
      if ((paVar30 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x2) ||
         (bVar35 = paVar29->_M_local_buf[(long)(pcVar14 + 1)],
         paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar30->_M_local_buf + 1), (byte)(bVar35 - 0x30) < 10)) goto LAB_018b87fa;
    }
    if ((bVar35 < 0x21) && ((0x100003e00U >> ((ulong)bVar35 & 0x3f) & 1) != 0)) {
      paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar30->_M_local_buf + 1);
      paVar30 = paVar41;
      if (paVar41 < paVar23) {
        paVar30 = paVar23;
      }
      goto LAB_018b788b;
    }
    goto LAB_018b87fa;
  }
  bVar5 = (byte)(0xb0 - bVar35) / 10;
  if ((SBORROW1(cVar31,-bVar5) != (char)(cVar31 + bVar5) < '\0') ||
     (((cVar31 = (cVar31 * '\n' - bVar35) + '0', paVar41 = paVar23,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(pcVar28 + ~(ulong)paVar30) != paVar29 &&
       (paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar30->_M_local_buf + 1), paVar29->_M_local_buf[(long)(pcVar14 + 1)] == '_')
       ) && (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pcVar28 + (-2 - (long)paVar30)) == paVar29 ||
             (paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar30->_M_local_buf + 2),
             9 < (byte)(paVar29->_M_local_buf[(long)(pcVar14 + 2)] - 0x30U))))))) goto LAB_018b87fa;
  goto LAB_018b564d;
LAB_018b788b:
  if (paVar23 <= paVar41) goto joined_r0x018b8546;
  if ((0x20 < (ulong)(byte)paVar29->_M_local_buf
                           [(long)((long)&((BaseScanner *)
                                          (&((BaseScanner *)this_02._M_p)->states + -0x20))->
                                          _vptr_BaseScanner + (long)paVar41)]) ||
     ((0x100003e00U >>
       ((ulong)(byte)paVar29->_M_local_buf
                     [(long)((long)&((BaseScanner *)(&((BaseScanner *)this_02._M_p)->states + -0x20)
                                    )->_vptr_BaseScanner + (long)paVar41)] & 0x3f) & 1) == 0))
  goto LAB_018b87fa;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(paVar41->_M_local_buf + 1);
  goto LAB_018b788b;
LAB_018b75dc:
  if (local_130 <= paVar30) goto joined_r0x018b8546;
  pcVar14 = (char *)((long)paVar30 + (long)(&((BaseScanner *)this_02._M_p)->states + -0x20));
  if (((char *)((long)paVar29 + 1))[(long)pcVar14] == '0') {
    bVar5 = 0;
  }
  else {
    if (((char *)((long)paVar29 + 1))[(long)pcVar14] != '1') goto LAB_018b87fa;
    bVar5 = 1;
  }
  paVar41 = local_130;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(pcVar28 + (-2 - (long)paVar30)) != paVar29) {
    if (((char *)((long)paVar29 + 2))[(long)pcVar14] == '_') {
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pcVar28 + (-3 - (long)paVar30)) == paVar29) ||
         ((((char *)((long)paVar29 + 3))[(long)pcVar14] & 0xfeU) != 0x30)) goto LAB_018b87fa;
      paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar30 + 2);
    }
    else {
      paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar30 + 1);
    }
  }
  paVar30 = paVar41;
  if ('?' < (char)bVar35) goto LAB_018b87fa;
  bVar35 = bVar5 | bVar35 * '\x02';
  goto LAB_018b75dc;
LAB_018b613a:
  if (local_130 <= paVar30) goto joined_r0x018b8546;
  pcVar14 = (char *)((long)paVar30 + (long)(&((BaseScanner *)this_02._M_p)->states + -0x20));
  bVar35 = ((char *)((long)paVar29 + 1))[(long)pcVar14];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  local_e0 = paVar30;
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  if (!bVar4) goto LAB_018b87fa;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  paVar30 = local_130;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(pcVar28 + (-2 - (long)local_e0)) != paVar29) {
    if (((char *)((long)paVar29 + 2))[(long)pcVar14] == '_') {
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pcVar28 + (-3 - (long)local_e0)) == paVar29) ||
         (bVar4 = StringUtil::CharacterIsHex(((char *)((long)paVar29 + 3))[(long)pcVar14]), !bVar4))
      goto LAB_018b87fa;
      paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)local_e0 + 2);
    }
    else {
      paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)local_e0 + 1);
    }
  }
  if ((char)(cVar31 + bVar5 ^ 0x7f) / '\x10' < (char)local_138) goto LAB_018b87fa;
  local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_138._4_4_,(uint)(byte)(cVar31 + bVar5 + (char)local_138 * '\x10'));
  goto LAB_018b613a;
joined_r0x018b8546:
  paVar29 = local_140;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x1 < paVar30) goto LAB_018b9355;
  goto LAB_018b87fa;
LAB_018b6681:
  uVar18 = uVar16;
  if (uVar34 <= uVar18) goto LAB_018b7499;
  lVar13 = (long)&((BaseScanner *)(&((BaseScanner *)this_02._M_p)->states + -0x20))->
                  _vptr_BaseScanner + uVar18;
  cVar2 = paVar29->_M_local_buf[lVar13];
  uVar37 = (undefined7)((ulong)in_R11 >> 8);
  in_R11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT71(uVar37,cVar2);
  if (9 < (byte)(cVar2 - 0x30U)) {
    if (cVar2 == '.') {
      uVar16 = uVar18 + 1;
      if (uVar34 <= uVar16) {
        bVar4 = uVar26 < uVar18;
        uVar18 = uVar16;
        if (bVar4) goto LAB_018b7499;
        goto LAB_018b87fa;
      }
      if ((uVar18 <= uVar26) ||
         (in_R11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT71(uVar37,paVar29->_M_local_buf[lVar13 + 1]), uVar18 = uVar16,
         (byte)(paVar29->_M_local_buf[lVar13 + 1] - 0x30U) < 10)) goto LAB_018b87fa;
    }
    if (((byte)in_R11 < 0x21) && ((0x100003e00U >> ((ulong)in_R11 & 0x3f) & 1) != 0)) {
      uVar16 = uVar18 + 1;
      uVar18 = uVar16;
      if (uVar16 < uVar34) {
        uVar18 = uVar34;
      }
      goto LAB_018b7a05;
    }
    goto LAB_018b87fa;
  }
  if ((char)((byte)(0xafU - cVar2) / 10) < cVar31) goto LAB_018b87fa;
  in_R11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pcVar28 + ~uVar18);
  cVar31 = (cVar2 - 0x30U) + cVar31 * '\n';
  uVar16 = uVar34;
  if (((in_R11 != paVar29) && (uVar16 = uVar18 + 1, paVar29->_M_local_buf[lVar13 + 1] == '_')) &&
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(pcVar28 + (-2 - uVar18)) == paVar29 ||
      (uVar16 = uVar18 + 2, 9 < (byte)(paVar29->_M_local_buf[lVar13 + 2] - 0x30U)))))
  goto LAB_018b87fa;
  goto LAB_018b6681;
LAB_018b7a05:
  if (uVar34 <= uVar16) goto LAB_018b7499;
  if ((0x20 < (ulong)(byte)paVar29->_M_local_buf
                           [(long)&((BaseScanner *)(&((BaseScanner *)this_02._M_p)->states + -0x20))
                                   ->_vptr_BaseScanner + uVar16]) ||
     ((0x100003e00U >>
       ((ulong)(byte)paVar29->_M_local_buf
                     [(long)&((BaseScanner *)(&((BaseScanner *)this_02._M_p)->states + -0x20))->
                             _vptr_BaseScanner + uVar16] & 0x3f) & 1) == 0)) goto LAB_018b87fa;
  uVar16 = uVar16 + 1;
  goto LAB_018b7a05;
LAB_018b7499:
  paVar29 = local_140;
  if (uVar26 < uVar18) goto LAB_018b9355;
LAB_018b87fa:
  for (pcVar14 = (char *)0x0; uVar34 = (long)pcVar28 - (long)pcVar14, uVar34 != 0;
      pcVar14 = pcVar14 + 1) {
    bVar35 = pcVar14[(long)(&((BaseScanner *)this_02._M_p)->states + -0x20)];
    if ((0x20 < (ulong)bVar35) || ((0x100003e00U >> ((ulong)bVar35 & 0x3f) & 1) == 0)) {
      _dummy_value = (pointer)0x0;
      paStack_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
      local_118[0]._M_allocated_capacity = 0;
      if (bVar35 == 0x2d) {
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        uVar16 = 1;
        goto LAB_018b8848;
      }
      if ((pcVar28 + -1 != pcVar14) && (bVar35 == 0x30)) {
        cVar31 = ((undefined1 *)((long)&((BaseScanner *)this_02._M_p)->_vptr_BaseScanner + 1))
                 [(long)pcVar14];
        if (cVar31 == 'B') {
LAB_018b8c8a:
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1;
          goto LAB_018b8c9b;
        }
        if (cVar31 != 'x') {
          if (cVar31 == 'b') goto LAB_018b8c8a;
          if (cVar31 != 'X') goto LAB_018b8a1e;
        }
        local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar28 + ~(ulong)pcVar14);
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x1;
        goto LAB_018b893a;
      }
LAB_018b8a1e:
      uVar26 = (ulong)(bVar35 == 0x2b);
      paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      uVar16 = uVar26;
      goto LAB_018b8a2c;
    }
  }
  goto LAB_018b94d5;
  while( true ) {
    if (pcVar28 + (-2 - uVar26) == pcVar14) goto LAB_018b94d5;
    in_R11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    uVar16 = uVar26 + 2;
    paVar29 = in_R11;
    if (9 < (byte)((pcVar14 + 2)[lVar13] - 0x30U)) break;
LAB_018b8848:
    do {
      uVar26 = uVar16;
      if (uVar34 <= uVar26) goto LAB_018b8ad0;
      lVar13 = (long)&((BaseScanner *)(&((BaseScanner *)this_02._M_p)->states + -0x20))->
                      _vptr_BaseScanner + uVar26;
      bVar35 = pcVar14[lVar13];
      bVar5 = bVar35 - 0x30;
      if (9 < bVar5) {
        if (bVar35 != 0x2e) goto LAB_018b8d2a;
        uVar16 = uVar26 + 1;
        uVar33 = 0;
        uVar18 = uVar16;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        goto LAB_018b8b00;
      }
      in_R11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
      uVar16 = (0x8000000000000000 - (ulong)bVar5) / 10;
      paVar29 = in_R11;
      if (SBORROW8((long)paVar41,-uVar16) != (long)(paVar41->_M_local_buf + uVar16) < 0)
      goto LAB_018b9355;
      paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar41 * 10 - (ulong)bVar5);
      uVar16 = uVar34;
    } while ((pcVar28 + ~uVar26 == pcVar14) || (uVar16 = uVar26 + 1, (pcVar14 + 1)[lVar13] != '_'));
  }
  goto LAB_018b9355;
  while( true ) {
    _dummy_value = (pointer)paVar41;
    if (pcVar28 + (-2 - uVar17) == pcVar14) goto LAB_018b94d5;
    in_R11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    uVar18 = uVar17 + 2;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    if (9 < (byte)((pcVar14 + 2)[lVar13] - 0x30U)) break;
LAB_018b8b00:
    do {
      uVar17 = uVar18;
      if (uVar34 <= uVar17) {
        bVar4 = 1 < uVar26;
        local_118[0]._2_6_ = 0;
        local_118[0]._0_2_ = uVar33;
        uVar26 = uVar17;
        _dummy_value = (pointer)paVar41;
        paStack_120 = paVar23;
        if (uVar16 < uVar17 || bVar4) goto LAB_018b8ad0;
        goto LAB_018b94d5;
      }
      lVar13 = (long)&((BaseScanner *)(&((BaseScanner *)this_02._M_p)->states + -0x20))->
                      _vptr_BaseScanner + uVar17;
      bVar35 = pcVar14[lVar13];
      bVar5 = bVar35 - 0x30;
      if (9 < bVar5) {
        bVar4 = 1 < uVar26;
        local_118[0]._2_6_ = 0;
        local_118[0]._0_2_ = uVar33;
        uVar26 = uVar17;
        _dummy_value = (pointer)paVar41;
        paStack_120 = paVar23;
        if (uVar16 < uVar17 || bVar4) goto LAB_018b8d2a;
        goto LAB_018b94d5;
      }
      uVar18 = ((ulong)bVar5 ^ 0x7ffffffffffffffe) / 10;
      in_R11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)paVar23 * 10 + (ulong)bVar5);
      if ((long)uVar18 < (long)paVar23) {
        in_R11 = paVar23;
      }
      uVar33 = uVar33 + ((long)paVar23 <= (long)uVar18);
      uVar18 = uVar34;
      paVar23 = in_R11;
    } while ((pcVar28 + ~uVar17 == pcVar14) || (uVar18 = uVar17 + 1, (pcVar14 + 1)[lVar13] != '_'));
  }
  goto LAB_018b9355;
LAB_018b8d2a:
  uVar9 = (uint)bVar35;
  if (4 < uVar9 - 9) {
    if ((uVar9 == 0x65) || (uVar9 == 0x45)) {
      _dummy_value = (pointer)paVar41;
      if ((uVar26 != 1) && (uVar26 + 1 < uVar34)) {
        exponent.result = 0;
        pcVar40 = pcVar14 + (long)&((BaseScanner *)(&((BaseScanner *)this_02._M_p)->states + -0x20))
                                   ->_vptr_BaseScanner + uVar26 + 1;
        if (*pcVar40 == '-') {
          bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar40,(idx_t)(pcVar28 + (~(ulong)pcVar14 - uVar26)),&exponent,false);
        }
        else {
          bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar40,(idx_t)(pcVar28 + (~(ulong)pcVar14 - uVar26)),&exponent,false);
        }
        if (bVar4 != false) {
          bVar4 = IntegerDecimalCastOperation::
                  HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,true>
                            ((IntegerDecimalCastData<signed_char> *)&dummy_value,exponent.result);
          goto joined_r0x018b94cf;
        }
      }
    }
    else {
      _dummy_value = (pointer)paVar41;
      if (uVar9 == 0x20) goto LAB_018b8d43;
    }
    goto LAB_018b94d5;
  }
LAB_018b8d43:
  uVar16 = uVar26 + 1;
  uVar26 = uVar16;
  if (uVar16 < uVar34) {
    uVar26 = uVar34;
  }
  for (; uVar16 < uVar34; uVar16 = uVar16 + 1) {
    _dummy_value = (pointer)paVar41;
    if ((0x20 < (ulong)(byte)pcVar14[(long)&((BaseScanner *)
                                            (&((BaseScanner *)this_02._M_p)->states + -0x20))->
                                            _vptr_BaseScanner + uVar16]) ||
       ((0x100003e00U >>
         ((ulong)(byte)pcVar14[(long)&((BaseScanner *)
                                      (&((BaseScanner *)this_02._M_p)->states + -0x20))->
                                      _vptr_BaseScanner + uVar16] & 0x3f) & 1) == 0))
    goto LAB_018b94d5;
  }
LAB_018b8ad0:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,true>
                    ((IntegerDecimalCastData<signed_char> *)&dummy_value);
  bVar7 = 1 < uVar26;
LAB_018b8bbc:
  bVar4 = (bool)(bVar4 & bVar7);
joined_r0x018b94cf:
  if (bVar4 == false) goto LAB_018b94d5;
  goto LAB_018b8bc4;
LAB_018b8c9b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(pcVar28 + ~(ulong)pcVar14) <= paVar23) goto LAB_018b917a;
  pcVar40 = (char *)((long)paVar23 + (long)(&((BaseScanner *)this_02._M_p)->states + -0x20));
  in_R11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  if (((pcVar14 + 1)[(long)pcVar40] != '0') &&
     (in_R11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1,
     paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0, (pcVar14 + 1)[(long)pcVar40] != '1')) goto LAB_018b9355;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pcVar28 + ~(ulong)pcVar14);
  if (pcVar28 + (-2 - (long)paVar23) != pcVar14) {
    if ((pcVar14 + 2)[(long)pcVar40] == '_') {
      if ((pcVar28 + (-3 - (long)paVar23) == pcVar14) ||
         (((pcVar14 + 3)[(long)pcVar40] & 0xfeU) != 0x30)) goto LAB_018b94d5;
      paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar23 + 2);
    }
    else {
      paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar23 + 1);
    }
  }
  if (0x3fffffffffffffff < (long)paVar41) goto LAB_018b94d5;
  paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)in_R11 + (long)paVar41 * 2);
  paVar23 = paVar29;
  goto LAB_018b8c9b;
LAB_018b917a:
  _dummy_value = (pointer)paVar41;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                    ((IntegerDecimalCastData<signed_char> *)&dummy_value);
  goto LAB_018b9289;
LAB_018b893a:
  if (local_140 <= paVar23) goto LAB_018b9278;
  local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)paVar23 + (long)(&((BaseScanner *)this_02._M_p)->states + -0x20));
  bVar35 = (pcVar14 + 1)[(long)local_138];
  bVar5 = bVar35 | 0x20;
  if (0x19 < (byte)(bVar35 + 0xbf)) {
    bVar5 = bVar35;
  }
  bVar4 = StringUtil::CharacterIsHex(bVar5);
  if (!bVar4) goto LAB_018b94d5;
  cVar31 = -0x30;
  if ('`' < (char)bVar5) {
    cVar31 = -0x57;
  }
  paVar41 = local_140;
  local_130 = paVar29;
  if (pcVar28 + (-2 - (long)paVar23) != pcVar14) {
    if ((pcVar14 + 2)[(long)local_138] == '_') {
      if ((pcVar28 + (-3 - (long)paVar23) == pcVar14) ||
         (bVar4 = StringUtil::CharacterIsHex((pcVar14 + 3)[(long)local_138]), !bVar4))
      goto LAB_018b94d5;
      paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar23 + 2);
    }
    else {
      paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar23 + 1);
    }
  }
  if ((long)((ulong)((byte)(cVar31 + bVar5) >> 4) ^ 0x7ffffffffffffff) < (long)local_130)
  goto LAB_018b94d5;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)local_130 * 0x10 + (ulong)(byte)(cVar31 + bVar5));
  paVar23 = paVar41;
  goto LAB_018b893a;
LAB_018b9278:
  _dummy_value = (pointer)paVar29;
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                    ((IntegerDecimalCastData<signed_char> *)&dummy_value);
LAB_018b9289:
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x1 < paVar23 & bVar4) == 0) {
LAB_018b94d5:
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  }
  else {
LAB_018b8bc4:
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71((int7)((ulong)in_R11 >> 8),1);
  }
  goto LAB_018b9355;
  while( true ) {
    if (pcVar28 + (-2 - uVar18) == pcVar14) goto LAB_018b94d5;
    in_R11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    uVar16 = uVar18 + 2;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    if (9 < (byte)((pcVar14 + 2)[lVar13] - 0x30U)) break;
LAB_018b8a2c:
    do {
      uVar18 = uVar16;
      uVar16 = uVar18;
      if (uVar34 <= uVar18) goto LAB_018b8bac;
      lVar13 = (long)&((BaseScanner *)(&((BaseScanner *)this_02._M_p)->states + -0x20))->
                      _vptr_BaseScanner + uVar18;
      bVar5 = pcVar14[lVar13];
      bVar35 = bVar5 - 0x30;
      if (9 < bVar35) {
        if (bVar5 != 0x2e) goto LAB_018b8d81;
        uVar17 = uVar18 + 1;
        uVar33 = 0;
        uVar19 = uVar17;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        goto LAB_018b8be6;
      }
      in_R11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
      paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      if ((long)(((ulong)bVar35 ^ 0x7ffffffffffffffe) / 10) < (long)paVar41) goto LAB_018b9355;
      paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar41 * 10 + (ulong)bVar35);
      uVar16 = uVar34;
    } while ((pcVar28 + ~uVar18 == pcVar14) || (uVar16 = uVar18 + 1, (pcVar14 + 1)[lVar13] != '_'));
  }
  goto LAB_018b9355;
LAB_018b8d81:
  if (bVar5 - 9 < 5) {
LAB_018b8d9a:
    uVar18 = uVar18 + 1;
    uVar16 = uVar18;
    if (uVar18 < uVar34) {
      uVar16 = uVar34;
    }
    for (; uVar18 < uVar34; uVar18 = uVar18 + 1) {
      _dummy_value = (pointer)paVar41;
      if ((0x20 < (ulong)(byte)pcVar14[(long)&((BaseScanner *)
                                              (&((BaseScanner *)this_02._M_p)->states + -0x20))->
                                              _vptr_BaseScanner + uVar18]) ||
         ((0x100003e00U >>
           ((ulong)(byte)pcVar14[(long)&((BaseScanner *)
                                        (&((BaseScanner *)this_02._M_p)->states + -0x20))->
                                        _vptr_BaseScanner + uVar18] & 0x3f) & 1) == 0))
      goto LAB_018b94d5;
    }
LAB_018b8bac:
    _dummy_value = (pointer)paVar41;
    bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                      ((IntegerDecimalCastData<signed_char> *)&dummy_value);
    bVar7 = uVar26 < uVar16;
    goto LAB_018b8bbc;
  }
  if ((bVar5 == 0x65) || (bVar5 == 0x45)) {
    _dummy_value = (pointer)paVar41;
    if ((uVar18 == uVar26) || (uVar34 <= uVar18 + 1)) goto LAB_018b94d5;
    exponent.result = 0;
    pcVar40 = pcVar14 + (long)&((BaseScanner *)(&((BaseScanner *)this_02._M_p)->states + -0x20))->
                               _vptr_BaseScanner + uVar18 + 1;
    if (*pcVar40 == '-') {
      bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar40,(idx_t)(pcVar28 + (~(ulong)pcVar14 - uVar18)),&exponent,false);
    }
    else {
      bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar40,(idx_t)(pcVar28 + (~(ulong)pcVar14 - uVar18)),&exponent,false);
    }
    if (bVar4 == false) goto LAB_018b94d5;
    bVar4 = IntegerDecimalCastOperation::
            HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,false>
                      ((IntegerDecimalCastData<signed_char> *)&dummy_value,exponent.result);
    goto joined_r0x018b94cf;
  }
  _dummy_value = (pointer)paVar41;
  if (bVar5 == 0x20) goto LAB_018b8d9a;
  goto LAB_018b94d5;
  while( true ) {
    _dummy_value = (pointer)paVar41;
    if (pcVar28 + (-2 - uVar16) == pcVar14) goto LAB_018b94d5;
    in_R11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    uVar19 = uVar16 + 2;
    paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    if (9 < (byte)((pcVar14 + 2)[lVar13] - 0x30U)) break;
LAB_018b8be6:
    do {
      uVar16 = uVar19;
      if (uVar34 <= uVar16) {
        local_118[0]._2_6_ = 0;
        local_118[0]._0_2_ = uVar33;
        paStack_120 = paVar23;
        if ((uVar26 < uVar18) || (_dummy_value = (pointer)paVar41, uVar17 < uVar16))
        goto LAB_018b8bac;
        goto LAB_018b94d5;
      }
      lVar13 = (long)&((BaseScanner *)(&((BaseScanner *)this_02._M_p)->states + -0x20))->
                      _vptr_BaseScanner + uVar16;
      bVar5 = pcVar14[lVar13];
      bVar35 = bVar5 - 0x30;
      if (9 < bVar35) {
        local_118[0]._2_6_ = 0;
        local_118[0]._0_2_ = uVar33;
        bVar4 = uVar26 < uVar18;
        uVar18 = uVar16;
        paStack_120 = paVar23;
        if ((bVar4) || (_dummy_value = (pointer)paVar41, uVar17 < uVar16)) goto LAB_018b8d81;
        goto LAB_018b94d5;
      }
      uVar19 = ((ulong)bVar35 ^ 0x7ffffffffffffffe) / 10;
      in_R11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)paVar23 * 10 + (ulong)bVar35);
      if ((long)uVar19 < (long)paVar23) {
        in_R11 = paVar23;
      }
      uVar33 = uVar33 + ((long)paVar23 <= (long)uVar19);
      uVar19 = uVar34;
      paVar23 = in_R11;
    } while ((pcVar28 + ~uVar16 == pcVar14) || (uVar19 = uVar16 + 1, (pcVar14 + 1)[lVar13] != '_'));
  }
LAB_018b9355:
  local_140 = paVar29;
  ::std::__cxx11::string::~string((string *)&strip_thousands);
  return (bool)(char)local_140;
}

Assistant:

bool CSVSniffer::CanYouCastIt(ClientContext &context, const string_t value, const LogicalType &type,
                              const DialectOptions &dialect_options, const bool is_null, const char decimal_separator,
                              const char thousands_separator) {
	if (is_null) {
		return true;
	}
	auto value_ptr = value.GetData();
	auto value_size = value.GetSize();
	string strip_thousands;
	if (type.IsNumeric() && thousands_separator != '\0') {
		// If we have a thousands separator we should try to use that
		strip_thousands = BaseScanner::RemoveSeparator(value_ptr, value_size, thousands_separator);
		value_ptr = strip_thousands.c_str();
		value_size = strip_thousands.size();
	}
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN: {
		bool dummy_value;
		return TryCastStringBool(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::TINYINT: {
		int8_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, false);
	}
	case LogicalTypeId::SMALLINT: {
		int16_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::INTEGER: {
		int32_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::BIGINT: {
		int64_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::UTINYINT: {
		uint8_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::USMALLINT: {
		uint16_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::UINTEGER: {
		uint32_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::UBIGINT: {
		uint64_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::DOUBLE: {
		double dummy_value;
		return TryDoubleCast<double>(value_ptr, value_size, dummy_value, true, decimal_separator);
	}
	case LogicalTypeId::FLOAT: {
		float dummy_value;
		return TryDoubleCast<float>(value_ptr, value_size, dummy_value, true, decimal_separator);
	}
	case LogicalTypeId::DATE: {
		if (!dialect_options.date_format.find(LogicalTypeId::DATE)->second.GetValue().Empty()) {
			date_t result;
			string error_message;
			return dialect_options.date_format.find(LogicalTypeId::DATE)
			    ->second.GetValue()
			    .TryParseDate(value, result, error_message);
		}
		idx_t pos;
		bool special;
		date_t dummy_value;
		return Date::TryConvertDate(value_ptr, value_size, pos, dummy_value, special, true) == DateCastResult::SUCCESS;
	}
	case LogicalTypeId::TIMESTAMP: {
		timestamp_t dummy_value;
		if (!dialect_options.date_format.find(LogicalTypeId::TIMESTAMP)->second.GetValue().Empty()) {
			string error_message;
			return dialect_options.date_format.find(LogicalTypeId::TIMESTAMP)
			    ->second.GetValue()
			    .TryParseTimestamp(value, dummy_value, error_message);
		}
		return Timestamp::TryConvertTimestamp(value_ptr, value_size, dummy_value, nullptr, true) ==
		       TimestampCastResult::SUCCESS;
	}
	case LogicalTypeId::TIME: {
		idx_t pos;
		dtime_t dummy_value;
		return Time::TryConvertTime(value_ptr, value_size, pos, dummy_value, true);
	}
	case LogicalTypeId::DECIMAL: {
		uint8_t width, scale;
		type.GetDecimalProperties(width, scale);
		if (decimal_separator == ',') {
			switch (type.InternalType()) {
			case PhysicalType::INT16: {
				int16_t dummy_value;
				return TryDecimalStringCast<int16_t, ','>(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT32: {
				int32_t dummy_value;
				return TryDecimalStringCast<int32_t, ','>(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT64: {
				int64_t dummy_value;
				return TryDecimalStringCast<int64_t, ','>(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT128: {
				hugeint_t dummy_value;
				return TryDecimalStringCast<hugeint_t, ','>(value_ptr, value_size, dummy_value, width, scale);
			}

			default:
				throw InternalException("Invalid Physical Type for Decimal Value. Physical Type: " +
				                        TypeIdToString(type.InternalType()));
			}

		} else if (decimal_separator == '.') {
			switch (type.InternalType()) {
			case PhysicalType::INT16: {
				int16_t dummy_value;
				return TryDecimalStringCast(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT32: {
				int32_t dummy_value;
				return TryDecimalStringCast(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT64: {
				int64_t dummy_value;
				return TryDecimalStringCast(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT128: {
				hugeint_t dummy_value;
				return TryDecimalStringCast(value_ptr, value_size, dummy_value, width, scale);
			}

			default:
				throw InternalException("Invalid Physical Type for Decimal Value. Physical Type: " +
				                        TypeIdToString(type.InternalType()));
			}
		}
		throw InvalidInputException("Decimals can only have ',' and '.' as decimal separators");
	}
	case LogicalTypeId::VARCHAR:
		return true;
	default: {
		// We do Value Try Cast for non-basic types.
		Value new_value;
		string error_message;
		Value str_value(value);
		bool success = str_value.TryCastAs(context, type, new_value, &error_message, true);
		return success && error_message.empty();
	}
	}
}